

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O3

NodeRecordMB4D * __thiscall
embree::avx::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<4>,_embree::avx::GridRecalculatePrimRef,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::avx::CreateMSMBlurLeafGrid<4>,_embree::Scene::BuildProgressMonitorInterface>
::createLargeLeaf(NodeRecordMB4D *__return_storage_ptr__,
                 BuilderT<embree::NodeRefPtr<4>,_embree::avx::GridRecalculatePrimRef,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::avx::CreateMSMBlurLeafGrid<4>,_embree::Scene::BuildProgressMonitorInterface>
                 *this,BuildRecord *in,CachedAllocator alloc)

{
  atomic<unsigned_long> *paVar1;
  long *plVar2;
  pointer *pppTVar3;
  char *pcVar4;
  ushort uVar5;
  ushort uVar6;
  int iVar7;
  MemoryMonitorInterface *pMVar8;
  iterator iVar9;
  BBox1f *pBVar10;
  Geometry *pGVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  int iVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  SubGridBuildData *pSVar30;
  BBox1f BVar31;
  char cVar32;
  uint uVar33;
  long lVar34;
  long lVar35;
  BBox1f BVar36;
  void *pvVar37;
  ulong uVar38;
  size_t sVar39;
  undefined8 *puVar40;
  runtime_error *prVar41;
  ushort uVar42;
  long lVar43;
  BBox1f BVar44;
  uint *puVar45;
  float *pfVar46;
  ushort uVar47;
  BBox1f *pBVar48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar49;
  mvector<PrimRefMB> *prims;
  ulong uVar50;
  char *pcVar51;
  ulong uVar52;
  BBox1f BVar53;
  long lVar54;
  undefined4 uVar55;
  size_t y_1;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  undefined1 (*pauVar59) [16];
  long lVar60;
  long lVar61;
  BBox1f BVar62;
  ulong uVar63;
  PrimRefMB *pPVar64;
  BuildRecord *in_00;
  bool bVar65;
  float fVar66;
  undefined8 uVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined8 uVar76;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [32];
  float fVar77;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar85;
  float fVar86;
  float fVar91;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar107;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  float fVar127;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [64];
  float fVar137;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar149;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [64];
  anon_struct_12_3_4e92e0dd_for_anon_union_16_2_47237d3f_for_Vec3fa_0_1 aVar160;
  undefined1 auVar154 [16];
  undefined1 auVar155 [64];
  undefined1 auVar156 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar157;
  undefined1 auVar158 [64];
  undefined1 auVar159 [16];
  BBox1f time_range1;
  BBox1f time_range0;
  PrimRefVector lprims;
  uint geomIDs [4];
  uint x [4];
  anon_class_1_0_00000001 reduction;
  BBox3fa bounds0 [4];
  BBox3fa bounds1 [4];
  vbool vSplitMask;
  anon_class_1_0_00000001 reduction2;
  uint y [4];
  uint primID [4];
  BuildRecordSplit current;
  NodeRecordMB4D values [16];
  AABBNode node0;
  task_group_context *in_stack_ffffffffffffe0c0;
  BBox1f local_1f28;
  undefined8 local_1f20;
  undefined8 uStack_1f18;
  SetMB *local_1f00;
  undefined1 local_1ef0 [8];
  float fStack_1ee8;
  float fStack_1ee4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1ee0;
  BBox1f local_1ec8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1ec0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1eb0;
  uint local_1ea0;
  undefined4 uStack_1e9c;
  undefined8 uStack_1e98;
  HeuristicMBlurTemporalSplit<embree::PrimRefMB,_embree::sse2::VirtualRecalculatePrimRef,_2UL>
  *local_1e90;
  NodeRecordMB4D *local_1e80;
  ulong local_1e78;
  BBox1f local_1e70;
  BBox1f local_1e68;
  BBox1f local_1e60;
  BuildRecord *local_1e58;
  BBox1f local_1e50 [2];
  undefined1 local_1e40 [16];
  undefined1 local_1e30 [16];
  undefined1 local_1e20 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1e10;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1e00;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1df0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1de0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1dd0;
  BBox1f local_1dc0;
  BBox1f BStack_1db8;
  size_t sStack_1db0;
  size_t sStack_1da8;
  float local_1da0;
  float fStack_1d9c;
  float fStack_1d98;
  float fStack_1d94;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1d90;
  undefined8 uStack_1d80;
  undefined4 uStack_1d78;
  undefined4 uStack_1d74;
  undefined4 local_1d70;
  undefined4 uStack_1d6c;
  undefined4 uStack_1d68;
  undefined4 uStack_1d64;
  undefined4 uStack_1d60;
  undefined4 uStack_1d5c;
  undefined4 uStack_1d58;
  undefined4 uStack_1d54;
  undefined4 local_1d50;
  undefined4 uStack_1d4c;
  undefined4 uStack_1d48;
  undefined4 uStack_1d44;
  undefined4 uStack_1d40;
  undefined4 uStack_1d3c;
  undefined4 uStack_1d38;
  undefined4 uStack_1d34;
  BBox1f local_1d30;
  BBox1f BStack_1d28;
  undefined8 uStack_1d20;
  undefined8 uStack_1d18;
  undefined4 local_1d10;
  undefined4 uStack_1d0c;
  undefined4 uStack_1d08;
  undefined4 uStack_1d04;
  ulong local_1d00;
  BBox1f local_1cf8;
  char *local_1cf0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1ce8;
  undefined1 local_1cd8 [8];
  undefined1 local_1cd0 [16];
  undefined1 local_1cc0 [16];
  undefined1 local_1cb0 [12];
  undefined2 uStack_1ca4;
  undefined2 uStack_1ca2;
  undefined1 local_1ca0 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1c90;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1c80;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1c70;
  BBox1f local_1c60;
  BBox1f BStack_1c58;
  BBox1f BStack_1c50;
  BBox1f BStack_1c48;
  BBox1f local_1c40;
  BBox1f BStack_1c38;
  BBox1f BStack_1c30;
  BBox1f BStack_1c28;
  undefined1 auStack_1c20 [16];
  BBox1f local_1c10;
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  BBox1f local_1bf0;
  BBox1f local_1be0;
  BBox1f BStack_1bd8;
  BBox1f BStack_1bd0;
  BBox1f BStack_1bc8;
  undefined1 local_1bc0 [16];
  undefined1 local_1bb0 [136];
  BBox1f BStack_1b28;
  BBox1f local_1b20;
  undefined8 local_1b10;
  undefined8 uStack_1b08;
  undefined8 local_1b00;
  size_type local_1af0;
  undefined8 uStack_1ae8;
  size_type sStack_1ae0;
  undefined8 uStack_1ad8;
  anon_class_40_5_808acc65 local_1ad0;
  size_t local_1aa0;
  ulong local_1a98;
  ulong local_1a90;
  PrimRefMB *local_1a88;
  SubGridBuildData *local_1a80;
  ulong local_1a78;
  char *local_1a70;
  anon_class_24_3_35f68c7c local_1a68;
  undefined1 local_1a50 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1a40;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1a30;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1a20;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1a10;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1a00;
  undefined4 local_19f0;
  undefined4 uStack_19ec;
  undefined4 uStack_19e8;
  undefined4 uStack_19e4;
  size_t local_19e0;
  size_t sStack_19d8;
  BBox1f BStack_19d0;
  BBox1f BStack_19c8;
  undefined4 local_19c0;
  undefined8 local_19bc;
  undefined4 local_19b4;
  undefined1 local_19b0 [8];
  undefined8 uStack_19a8;
  anon_union_8_2_d71db6ad_for_task_group_context_11 local_19a0;
  intrusive_list_node *local_1990;
  intrusive_list_node *piStack_1988;
  string_resource_index local_1970;
  ulong local_1930;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1920;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1910;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1900;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_18f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_18e0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_18d0;
  BBox1f local_18c0;
  BBox1f BStack_18b8;
  BBox1f BStack_18b0;
  size_t sStack_18a8;
  BBox1f BStack_18a0;
  BBox1f BStack_1898;
  BBox1f local_1890;
  undefined8 *local_1880;
  undefined4 uStack_1878;
  uint uStack_1874;
  undefined8 local_1870;
  undefined8 local_1860;
  undefined8 uStack_1858;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1850;
  BBox1f local_1840;
  size_t sStack_1838;
  BBox1f BStack_1830;
  BBox1f BStack_1828;
  anon_struct_12_3_4e92e0dd_for_anon_union_16_2_47237d3f_for_Vec3fa_0_1 local_1820;
  undefined4 local_1810 [4];
  anon_struct_12_3_4e92e0dd_for_anon_union_16_2_47237d3f_for_Vec3fa_0_1 local_1800;
  BBox1f local_17f0;
  undefined4 uStack_17e8;
  undefined4 uStack_17e4;
  anon_struct_12_3_4e92e0dd_for_anon_union_16_2_47237d3f_for_Vec3fa_0_1 local_17e0;
  undefined4 local_17d0 [353];
  undefined8 uStack_124c;
  undefined1 local_1240 [24];
  BBox1f BStack_1228;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1210;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_11f0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_11e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_11d0;
  BBox1f BStack_11c0;
  size_t sStack_11b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_11b0;
  BBox1f local_11a0 [2];
  undefined1 local_1190 [8];
  undefined8 uStack_1188;
  int local_1180;
  int aiStack_117c [3];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1160 [226];
  BBox1f *local_340 [16];
  ulong local_2c0;
  BBox1f local_2b8;
  undefined8 local_2b0 [14];
  BBox1f aBStack_240 [49];
  long local_b8;
  
  local_1cd0._8_8_ = local_1cd0._0_8_;
  local_1cc0._8_8_ = local_1cc0._0_8_;
  uVar52 = in->depth;
  local_1e80 = __return_storage_ptr__;
  if ((this->cfg).maxDepth < uVar52) {
    puVar40 = (undefined8 *)__cxa_allocate_exception(0x30);
    local_1240._0_8_ = local_1240 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1240,"depth limit reached","");
    *puVar40 = &PTR__rtcore_error_02184a18;
    *(undefined4 *)(puVar40 + 1) = 1;
    puVar40[2] = puVar40 + 4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar40 + 2),local_1240._0_8_,
               (undefined1 *)(local_1240._0_8_ + local_1240._8_8_));
    __cxa_throw(puVar40,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  local_1ee0 = (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
               geomBounds.bounds0.lower.field_0;
  local_1eb0 = (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
               geomBounds.bounds0.upper.field_0;
  local_1ec0 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                    geomBounds.bounds1.lower.field_0;
  _local_1ef0 = (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                geomBounds.bounds1.upper.field_0;
  uVar67 = *(undefined8 *)
            &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
             lower.field_0;
  uStack_1f18 = *(undefined8 *)
                 ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
                         .centBounds.lower.field_0 + 8);
  local_1f20._0_4_ = (uint)uVar67;
  local_1f20._4_4_ = (undefined4)((ulong)uVar67 >> 0x20);
  uVar67 = *(undefined8 *)
            &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
             upper.field_0;
  uStack_1e98 = *(undefined8 *)
                 ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
                         .centBounds.upper.field_0 + 8);
  local_1ea0 = (uint)uVar67;
  uStack_1e9c = (undefined4)((ulong)uVar67 >> 0x20);
  BVar44 = (BBox1f)(in->prims).super_PrimInfoMB.object_range._begin;
  BVar36 = (BBox1f)(in->prims).super_PrimInfoMB.object_range._end;
  local_1840 = (BBox1f)(in->prims).super_PrimInfoMB.num_time_segments;
  sStack_1838 = (in->prims).super_PrimInfoMB.max_num_time_segments;
  BStack_1830 = (in->prims).super_PrimInfoMB.max_time_range;
  BStack_1828 = (in->prims).super_PrimInfoMB.time_range;
  BVar62 = (BBox1f)(in->prims).prims;
  BVar53 = (BBox1f)local_1240;
  local_1e58 = in;
  findFallback((Split *)BVar53,this,&in->prims);
  local_1160[0] = local_1210;
  uVar76 = local_1240._16_8_;
  uVar67 = local_1240._0_8_;
  local_18d0.m128[1] = (float)uStack_1e9c;
  local_18d0.m128[0] = (float)local_1ea0;
  local_18d0._8_8_ = uStack_1e98;
  local_18e0._8_8_ = uStack_1f18;
  local_18e0._M_allocated_capacity = (size_type)local_1f20;
  local_1930 = uVar52;
  local_1920 = local_1ee0;
  local_1910 = local_1eb0;
  local_1900 = local_1ec0;
  local_18f0 = _local_1ef0;
  local_18c0 = BVar44;
  BStack_18b8 = BVar36;
  BStack_18b0 = local_1840;
  sStack_18a8 = sStack_1838;
  BStack_18a0 = BStack_1830;
  BStack_1898 = BStack_1828;
  BVar31 = BStack_1898;
  local_1890 = BVar62;
  local_1880 = (undefined8 *)local_1240._0_8_;
  uStack_1878 = (undefined4)local_1240._8_8_;
  uStack_1874 = SUB84(local_1240._8_8_,4);
  local_1870 = local_1240._16_8_;
  local_1170._M_allocated_capacity = local_1220._0_8_;
  local_1170._8_8_ = local_1220._8_8_;
  local_1860 = local_1220._0_8_;
  uStack_1858 = local_1220._8_8_;
  local_1850 = local_1210;
  local_1e78 = (long)BVar36 - (long)BVar44;
  local_1cf8 = BVar36;
  if (local_1e78 == 0 || uVar52 != 1) {
    uVar33 = 0;
  }
  else {
    BStack_1898.lower = BStack_1828.lower;
    BStack_1898.upper = BStack_1828.upper;
    lVar43 = (long)BVar36 - (long)BVar44;
    if ((ulong)BVar36 < (ulong)BVar44 || lVar43 == 0) {
      auVar69 = ZEXT816(0xff8000007f800000);
    }
    else {
      pBVar48 = &(*(PrimRefMB **)((long)BVar62 + 0x20))[(long)BVar44].time_range;
      auVar69 = ZEXT816(0xff8000007f800000);
      do {
        auVar99._8_8_ = 0;
        auVar99._0_4_ = pBVar48->lower;
        auVar99._4_4_ = pBVar48->upper;
        auVar71 = vcmpps_avx(auVar69,auVar99,1);
        auVar70 = vinsertps_avx(auVar69,auVar99,0x50);
        auVar69 = vblendps_avx(auVar99,auVar69,2);
        auVar69 = vblendvps_avx(auVar69,auVar70,auVar71);
        pBVar48 = pBVar48 + 10;
        lVar43 = lVar43 + -1;
      } while (lVar43 != 0);
    }
    auVar71 = vmovshdup_avx(auVar69);
    auVar71 = vcmpps_avx(auVar71,ZEXT416((uint)BStack_1898.upper),1);
    auVar69 = vcmpps_avx(ZEXT416((uint)BStack_1898.lower),auVar69,1);
    auVar69 = vorps_avx(auVar69,auVar71);
    uVar33 = auVar69._0_4_ & 0xffffff01;
  }
  local_1e60 = BVar44;
  BStack_1898 = BVar31;
  if (((local_1e78 <= (this->cfg).maxLeafSize) && (uStack_1874 < 2)) && ((char)uVar33 == '\0')) {
    pPVar64 = *(PrimRefMB **)((long)BVar62 + 0x20);
    local_1e20._0_4_ = pPVar64[(long)BVar44].lbounds.bounds0.lower.field_0.m128[3];
    uVar33 = 1;
    if (1 < local_1e78) {
      lVar43 = 1;
      do {
        fVar85 = pPVar64[(long)BVar44 + lVar43].lbounds.bounds0.lower.field_0.m128[3];
        uVar52 = (ulong)uVar33;
        if (uVar33 != 0) {
          uVar50 = 0;
          do {
            if (fVar85 == *(float *)(local_1e20 + uVar50 * 4)) goto LAB_0138250e;
            uVar50 = uVar50 + 1;
          } while (uVar52 != uVar50);
        }
        uVar33 = uVar33 + 1;
        *(float *)(local_1e20 + uVar52 * 4) = fVar85;
LAB_0138250e:
        lVar43 = lVar43 + 1;
      } while (lVar43 != local_1e78);
    }
    local_1d00 = (ulong)uVar33;
    local_1bc0._0_8_ = (ulong)uVar33 * 0x90;
    BVar53 = (BBox1f)(alloc.talloc1)->parent;
    if (alloc.alloc != (((atomic<embree::FastAllocator_*> *)((long)BVar53 + 8))->_M_b)._M_p) {
      sStack_1838 = CONCAT71(sStack_1838._1_7_,1);
      local_1840 = BVar53;
      MutexSys::lock((MutexSys *)BVar53);
      if ((((atomic<embree::FastAllocator_*> *)((long)BVar53 + 8))->_M_b)._M_p !=
          (__pointer_type)0x0) {
        LOCK();
        paVar1 = &((((atomic<embree::FastAllocator_*> *)((long)BVar53 + 8))->_M_b)._M_p)->bytesUsed;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (long)*(void **)((long)BVar53 + 0xa8) + (long)*(void **)((long)BVar53 + 0x68);
        UNLOCK();
        LOCK();
        paVar1 = &((((atomic<embree::FastAllocator_*> *)((long)BVar53 + 8))->_M_b)._M_p)->bytesFree;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (((long)*(void **)((long)BVar53 + 0x58) + (long)*(void **)((long)BVar53 + 0x98)) -
             ((long)*(void **)((long)BVar53 + 0x50) + (long)*(void **)((long)BVar53 + 0x90)));
        UNLOCK();
        LOCK();
        paVar1 = &((((atomic<embree::FastAllocator_*> *)((long)BVar53 + 8))->_M_b)._M_p)->
                  bytesWasted;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (long)*(void **)((long)BVar53 + 0xb0) + (long)*(void **)((long)BVar53 + 0x70);
        UNLOCK();
      }
      auVar69 = ZEXT816(0) << 0x40;
      *(undefined1 (*) [32])((long)BVar53 + 0x58) = ZEXT1632(auVar69);
      *(undefined1 (*) [32])((long)BVar53 + 0x48) = ZEXT1632(auVar69);
      auVar75 = ZEXT1632(auVar69);
      if (alloc.alloc == (FastAllocator *)0x0) {
        *(undefined1 (*) [32])((long)BVar53 + 0x98) = auVar75;
        *(undefined1 (*) [32])((long)BVar53 + 0x88) = auVar75;
      }
      else {
        *(void **)((long)BVar53 + 0x60) = (void *)(alloc.alloc)->defaultBlockSize;
        *(undefined1 (*) [32])((long)BVar53 + 0x88) = auVar75;
        *(undefined1 (*) [32])((long)BVar53 + 0x98) = auVar75;
        *(void **)((long)BVar53 + 0xa0) = (void *)(alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (((atomic<embree::FastAllocator_*> *)((long)BVar53 + 8))->_M_b)._M_p = alloc.alloc;
      UNLOCK();
      local_1240._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
      local_1240[8] = 1;
      local_1cb0._0_8_ = BVar53;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar9._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar9._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar9,(ThreadLocal2 **)local_1cb0);
      }
      else {
        *iVar9._M_current = (ThreadLocal2 *)local_1cb0._0_8_;
        pppTVar3 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar3 = *pppTVar3 + 1;
      }
      MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      if ((char)sStack_1838 == '\x01') {
        MutexSys::unlock((MutexSys *)local_1840);
      }
    }
    (alloc.talloc1)->bytesUsed = local_1bc0._0_8_ + (alloc.talloc1)->bytesUsed;
    sVar39 = (alloc.talloc1)->cur;
    uVar50 = (ulong)(-(int)sVar39 & 0xf);
    uVar52 = local_1bc0._0_8_ + uVar50 + sVar39;
    (alloc.talloc1)->cur = uVar52;
    if ((alloc.talloc1)->end < uVar52) {
      (alloc.talloc1)->cur = sVar39;
      if ((alloc.talloc1)->allocBlockSize < (ulong)(local_1bc0._0_8_ << 2)) {
        pcVar51 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)local_1bc0);
      }
      else {
        local_1240._0_8_ = (alloc.talloc1)->allocBlockSize;
        pcVar51 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)local_1240);
        (alloc.talloc1)->ptr = pcVar51;
        sVar39 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
        (alloc.talloc1)->bytesWasted = sVar39;
        (alloc.talloc1)->end = local_1240._0_8_;
        (alloc.talloc1)->cur = local_1bc0._0_8_;
        if ((ulong)local_1240._0_8_ < (ulong)local_1bc0._0_8_) {
          (alloc.talloc1)->cur = 0;
          local_1240._0_8_ = (alloc.talloc1)->allocBlockSize;
          pcVar51 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)local_1240);
          (alloc.talloc1)->ptr = pcVar51;
          sVar39 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
          (alloc.talloc1)->bytesWasted = sVar39;
          (alloc.talloc1)->end = local_1240._0_8_;
          (alloc.talloc1)->cur = local_1bc0._0_8_;
          if ((ulong)local_1240._0_8_ < (ulong)local_1bc0._0_8_) {
            (alloc.talloc1)->cur = 0;
            pcVar51 = (char *)0x0;
            goto LAB_01383037;
          }
        }
        (alloc.talloc1)->bytesWasted = sVar39;
      }
    }
    else {
      (alloc.talloc1)->bytesWasted = (alloc.talloc1)->bytesWasted + uVar50;
      pcVar51 = (alloc.talloc1)->ptr + (uVar52 - local_1bc0._0_8_);
    }
LAB_01383037:
    uVar52 = 7;
    if (local_1d00 < 7) {
      uVar52 = local_1d00;
    }
    local_1aa0 = uVar52 | (ulong)pcVar51 | 8;
    if (local_1d00 == 0) {
      aVar157.m128[2] = -INFINITY;
      aVar157._0_8_ = 0xff800000ff800000;
      aVar157.m128[3] = -INFINITY;
      local_1e40._8_4_ = 0x7f800000;
      local_1e40._0_8_ = 0x7f8000007f800000;
      local_1e40._12_4_ = 0x7f800000;
      local_1e30._8_4_ = 0x7f800000;
      local_1e30._0_8_ = 0x7f8000007f800000;
      local_1e30._12_4_ = 0x7f800000;
      aVar149 = aVar157;
    }
    else {
      pPVar64 = pPVar64 + (long)BVar44;
      local_1e40._8_4_ = 0x7f800000;
      local_1e40._0_8_ = 0x7f8000007f800000;
      local_1e40._12_4_ = 0x7f800000;
      auVar155 = ZEXT1664(local_1e40);
      auVar73._8_4_ = 0xff800000;
      auVar73._0_8_ = 0xff800000ff800000;
      auVar73._12_4_ = 0xff800000;
      auVar69 = ZEXT816(0) << 0x40;
      auVar159._8_4_ = 0xddccb9a2;
      auVar159._0_8_ = 0xddccb9a2ddccb9a2;
      auVar159._12_4_ = 0xddccb9a2;
      auVar94._8_4_ = 0x5dccb9a2;
      auVar94._0_8_ = 0x5dccb9a25dccb9a2;
      auVar94._12_4_ = 0x5dccb9a2;
      local_1cf0 = pcVar51;
      local_1a98 = 0;
      auVar153 = ZEXT1664(auVar73);
      auVar158 = ZEXT1664(auVar73);
      local_1a88 = pPVar64;
      uVar52 = local_1d00;
      BVar53 = local_1cf8;
      local_1e30 = local_1e40;
      do {
        auVar136 = ZEXT1664(auVar69);
        uVar33 = *(uint *)(local_1e20 + local_1a98 * 4);
        uVar50 = (ulong)uVar33;
        fVar85 = BStack_1898.lower;
        fVar91 = BStack_1898.upper;
        if (BVar53 == local_1e60) {
          uVar58 = 0;
        }
        else {
          pGVar11 = (((this->createLeaf).scene)->geometries).items[uVar50].ptr;
          local_1a80 = (this->createLeaf).sgrids;
          lVar43 = 0;
          uVar58 = 0;
          local_1a70 = pcVar51;
          local_1a78 = uVar50;
          do {
            pSVar30 = local_1a80;
            if (pPVar64[lVar43].lbounds.bounds0.lower.field_0.m128[3] == (float)uVar50) {
              local_1cd0 = auVar153._0_16_;
              fVar107 = pPVar64[lVar43].lbounds.bounds0.upper.field_0.m128[3];
              uVar5 = local_1a80[(uint)fVar107].sx;
              *(uint *)((long)&local_1d90 + uVar58 * 4) = (uint)uVar5;
              uVar42 = pSVar30[(uint)fVar107].sy;
              *(uint *)(local_1a50 + uVar58 * 4 + 0x10) = (uint)uVar42;
              uVar33 = pSVar30[(uint)fVar107].primID;
              *(uint *)(local_19b0 + uVar58 * 4) = uVar33;
              uVar50 = (ulong)uVar5 & 0x7fff;
              uVar52 = (ulong)uVar42 & 0x7fff;
              lVar35 = (ulong)uVar33 *
                       pGVar11[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
              lVar34 = *(long *)&pGVar11->field_0x58;
              fVar107 = pGVar11->fnumTimeSegments;
              fVar137 = (pGVar11->time_range).lower;
              fVar127 = (pGVar11->time_range).upper - fVar137;
              fVar77 = (fVar85 - fVar137) / fVar127;
              fVar127 = (fVar91 - fVar137) / fVar127;
              fVar137 = fVar107 * fVar77;
              fVar20 = fVar107 * fVar127;
              auVar69 = vroundss_avx(ZEXT416((uint)fVar137),ZEXT416((uint)fVar137),9);
              auVar71 = vroundss_avx(ZEXT416((uint)fVar20),ZEXT416((uint)fVar20),10);
              iVar7 = (int)auVar69._0_4_;
              if ((int)auVar69._0_4_ < 0) {
                iVar7 = -1;
              }
              iVar21 = (int)fVar107 + 1;
              if ((int)auVar71._0_4_ < (int)fVar107 + 1) {
                iVar21 = (int)auVar71._0_4_;
              }
              uVar5 = *(ushort *)(lVar34 + 10 + lVar35);
              uVar63 = (ulong)uVar5;
              if (uVar52 + 3 < (ulong)uVar5) {
                uVar63 = uVar52 + 3;
              }
              auVar69 = vmaxss_avx(auVar69,ZEXT416(0));
              auVar71 = vminss_avx(auVar71,ZEXT416((uint)fVar107));
              uVar42 = (ushort)uVar52;
              local_1cc0 = auVar158._0_16_;
              fVar66 = auVar71._0_4_;
              fVar86 = auVar69._0_4_;
              auVar80 = auVar155._0_16_;
              uVar47 = (ushort)uVar50;
              auVar69 = auVar80;
              auVar70 = auVar80;
              auVar71 = auVar80;
              auVar99 = auVar80;
              if (uVar42 < uVar5) {
                local_1a90 = uVar50 + 3;
                uVar6 = *(ushort *)(lVar34 + 8 + lVar35);
                uVar38 = (ulong)uVar6;
                if (local_1a90 < uVar6) {
                  uVar38 = local_1a90;
                }
                auVar136 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
                auVar153 = ZEXT1664(auVar80);
                uVar56 = uVar52;
                do {
                  if (uVar47 < uVar6) {
                    lVar61 = (long)(int)fVar86 * 0x38;
                    lVar60 = *(long *)(*(long *)&pGVar11[2].numPrimitives + 0x10 + lVar61);
                    pauVar59 = (undefined1 (*) [16])
                               ((*(uint *)(lVar34 + lVar35) + uVar50 +
                                *(uint *)(lVar34 + 4 + lVar35) * uVar56) * lVar60 +
                               *(long *)(*(long *)&pGVar11[2].numPrimitives + lVar61));
                    lVar61 = uVar38 - uVar50;
                    do {
                      auVar69 = *pauVar59;
                      auVar71 = vcmpps_avx(auVar69,auVar159,6);
                      auVar87 = vcmpps_avx(auVar69,auVar94,1);
                      auVar71 = vandps_avx(auVar71,auVar87);
                      uVar55 = vmovmskps_avx(auVar71);
                      if ((~(byte)uVar55 & 7) != 0) {
                        auVar82._8_4_ = 0xff800000;
                        auVar82._0_8_ = 0xff800000ff800000;
                        auVar82._12_4_ = 0xff800000;
                        auVar69 = auVar80;
                        goto LAB_013833a8;
                      }
                      auVar71 = vminps_avx(auVar153._0_16_,auVar69);
                      auVar153 = ZEXT1664(auVar71);
                      auVar69 = vmaxps_avx(auVar136._0_16_,auVar69);
                      auVar136 = ZEXT1664(auVar69);
                      pauVar59 = (undefined1 (*) [16])(*pauVar59 + lVar60);
                      lVar61 = lVar61 + -1;
                    } while (lVar61 != 0);
                  }
                  auVar82 = auVar136._0_16_;
                  auVar69 = auVar153._0_16_;
                  uVar56 = uVar56 + 1;
                } while (uVar56 != uVar63);
LAB_013833a8:
                lVar60 = (long)(int)fVar66 * 0x38;
                auVar153 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
                auVar136 = ZEXT1664(auVar80);
                uVar56 = uVar52;
                do {
                  if (uVar47 < uVar6) {
                    lVar61 = *(long *)(*(long *)&pGVar11[2].numPrimitives + 0x10 + lVar60);
                    pauVar59 = (undefined1 (*) [16])
                               ((*(uint *)(lVar34 + lVar35) + uVar50 +
                                *(uint *)(lVar34 + 4 + lVar35) * uVar56) * lVar61 +
                               *(long *)(*(long *)&pGVar11[2].numPrimitives + lVar60));
                    lVar54 = uVar38 - uVar50;
                    do {
                      auVar71 = *pauVar59;
                      auVar87 = vcmpps_avx(auVar71,auVar159,6);
                      auVar72 = vcmpps_avx(auVar71,auVar94,1);
                      auVar87 = vandps_avx(auVar87,auVar72);
                      uVar55 = vmovmskps_avx(auVar87);
                      if ((~(byte)uVar55 & 7) != 0) {
                        auVar120._8_4_ = 0xff800000;
                        auVar120._0_8_ = 0xff800000ff800000;
                        auVar120._12_4_ = 0xff800000;
                        auVar71 = auVar80;
                        goto LAB_0138343d;
                      }
                      auVar87 = vminps_avx(auVar136._0_16_,auVar71);
                      auVar136 = ZEXT1664(auVar87);
                      auVar71 = vmaxps_avx(auVar153._0_16_,auVar71);
                      auVar153 = ZEXT1664(auVar71);
                      pauVar59 = (undefined1 (*) [16])(*pauVar59 + lVar61);
                      lVar54 = lVar54 + -1;
                    } while (lVar54 != 0);
                  }
                  auVar120 = auVar153._0_16_;
                  auVar71 = auVar136._0_16_;
                  uVar56 = uVar56 + 1;
                } while (uVar56 != uVar63);
LAB_0138343d:
                if (iVar21 - iVar7 != 1) {
                  if (uVar42 < uVar5) {
                    uVar6 = *(ushort *)(lVar34 + 8 + lVar35);
                    uVar38 = (ulong)uVar6;
                    if (local_1a90 < uVar6) {
                      uVar38 = local_1a90;
                    }
                    auVar155 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)
                                                 ));
                    auVar153 = ZEXT1664(auVar80);
                    uVar56 = uVar52;
                    do {
                      if (uVar47 < uVar6) {
                        lVar54 = (long)(int)fVar86 * 0x38;
                        lVar61 = *(long *)(*(long *)&pGVar11[2].numPrimitives + 0x48 + lVar54);
                        pauVar59 = (undefined1 (*) [16])
                                   ((*(uint *)(lVar34 + lVar35) + uVar50 +
                                    *(uint *)(lVar34 + 4 + lVar35) * uVar56) * lVar61 +
                                   *(long *)(*(long *)&pGVar11[2].numPrimitives + 0x38 + lVar54));
                        lVar54 = uVar38 - uVar50;
                        do {
                          auVar70 = *pauVar59;
                          auVar99 = vcmpps_avx(auVar70,auVar159,6);
                          auVar87 = vcmpps_avx(auVar70,auVar94,1);
                          auVar99 = vandps_avx(auVar87,auVar99);
                          uVar55 = vmovmskps_avx(auVar99);
                          if ((~(byte)uVar55 & 7) != 0) {
                            auVar110._8_4_ = 0xff800000;
                            auVar110._0_8_ = 0xff800000ff800000;
                            auVar110._12_4_ = 0xff800000;
                            auVar70 = auVar80;
                            goto LAB_013835b9;
                          }
                          auVar99 = vminps_avx(auVar153._0_16_,auVar70);
                          auVar153 = ZEXT1664(auVar99);
                          auVar70 = vmaxps_avx(auVar155._0_16_,auVar70);
                          auVar155 = ZEXT1664(auVar70);
                          pauVar59 = (undefined1 (*) [16])(*pauVar59 + lVar61);
                          lVar54 = lVar54 + -1;
                        } while (lVar54 != 0);
                      }
                      auVar110 = auVar155._0_16_;
                      auVar70 = auVar153._0_16_;
                      uVar56 = uVar56 + 1;
                    } while (uVar56 != uVar63);
LAB_013835b9:
                    auVar153 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)
                                                 ));
                    auVar155 = ZEXT1664(auVar80);
                    uVar56 = uVar52;
                    do {
                      if (uVar47 < uVar6) {
                        lVar61 = *(long *)(*(long *)&pGVar11[2].numPrimitives + -0x28 + lVar60);
                        pauVar59 = (undefined1 (*) [16])
                                   ((*(uint *)(lVar34 + lVar35) + uVar50 +
                                    *(uint *)(lVar34 + 4 + lVar35) * uVar56) * lVar61 +
                                   *(long *)(*(long *)&pGVar11[2].numPrimitives + -0x38 + lVar60));
                        lVar54 = uVar38 - uVar50;
                        do {
                          auVar99 = *pauVar59;
                          auVar87 = vcmpps_avx(auVar99,auVar159,6);
                          auVar72 = vcmpps_avx(auVar99,auVar94,1);
                          auVar87 = vandps_avx(auVar72,auVar87);
                          uVar55 = vmovmskps_avx(auVar87);
                          if ((~(byte)uVar55 & 7) != 0) {
                            auVar111._8_4_ = 0xff800000;
                            auVar111._0_8_ = 0xff800000ff800000;
                            auVar111._12_4_ = 0xff800000;
                            auVar99 = auVar80;
                            goto LAB_0138365b;
                          }
                          auVar87 = vminps_avx(auVar155._0_16_,auVar99);
                          auVar155 = ZEXT1664(auVar87);
                          auVar99 = vmaxps_avx(auVar153._0_16_,auVar99);
                          auVar153 = ZEXT1664(auVar99);
                          pauVar59 = (undefined1 (*) [16])(*pauVar59 + lVar61);
                          lVar54 = lVar54 + -1;
                        } while (lVar54 != 0);
                      }
                      auVar111 = auVar153._0_16_;
                      auVar99 = auVar155._0_16_;
                      uVar56 = uVar56 + 1;
                    } while (uVar56 != uVar63);
                  }
                  else {
                    auVar110._8_4_ = 0xff800000;
                    auVar110._0_8_ = 0xff800000ff800000;
                    auVar110._12_4_ = 0xff800000;
                    auVar111 = auVar110;
                  }
                  goto LAB_0138365b;
                }
LAB_0138345f:
                auVar70 = vmaxss_avx(ZEXT416((uint)(fVar137 - fVar86)),ZEXT816(0) << 0x40);
                auVar99 = vshufps_avx(auVar70,auVar70,0);
                auVar70 = ZEXT416((uint)(1.0 - auVar70._0_4_));
                auVar70 = vshufps_avx(auVar70,auVar70,0);
                auVar97._0_4_ = auVar70._0_4_ * auVar69._0_4_ + auVar71._0_4_ * auVar99._0_4_;
                auVar97._4_4_ = auVar70._4_4_ * auVar69._4_4_ + auVar71._4_4_ * auVar99._4_4_;
                auVar97._8_4_ = auVar70._8_4_ * auVar69._8_4_ + auVar71._8_4_ * auVar99._8_4_;
                auVar97._12_4_ = auVar70._12_4_ * auVar69._12_4_ + auVar71._12_4_ * auVar99._12_4_;
                auVar100._0_4_ = auVar70._0_4_ * auVar82._0_4_ + auVar99._0_4_ * auVar120._0_4_;
                auVar100._4_4_ = auVar70._4_4_ * auVar82._4_4_ + auVar99._4_4_ * auVar120._4_4_;
                auVar100._8_4_ = auVar70._8_4_ * auVar82._8_4_ + auVar99._8_4_ * auVar120._8_4_;
                auVar100._12_4_ = auVar70._12_4_ * auVar82._12_4_ + auVar99._12_4_ * auVar120._12_4_
                ;
                auVar70 = vmaxss_avx(ZEXT416((uint)(fVar66 - fVar20)),ZEXT816(0) << 0x40);
                auVar99 = vshufps_avx(auVar70,auVar70,0);
                auVar70 = ZEXT416((uint)(1.0 - auVar70._0_4_));
                auVar70 = vshufps_avx(auVar70,auVar70,0);
                auVar74._0_4_ = auVar71._0_4_ * auVar70._0_4_ + auVar99._0_4_ * auVar69._0_4_;
                auVar74._4_4_ = auVar71._4_4_ * auVar70._4_4_ + auVar99._4_4_ * auVar69._4_4_;
                auVar74._8_4_ = auVar71._8_4_ * auVar70._8_4_ + auVar99._8_4_ * auVar69._8_4_;
                auVar74._12_4_ = auVar71._12_4_ * auVar70._12_4_ + auVar99._12_4_ * auVar69._12_4_;
                auVar83._0_4_ = auVar99._0_4_ * auVar82._0_4_ + auVar70._0_4_ * auVar120._0_4_;
                auVar83._4_4_ = auVar99._4_4_ * auVar82._4_4_ + auVar70._4_4_ * auVar120._4_4_;
                auVar83._8_4_ = auVar99._8_4_ * auVar82._8_4_ + auVar70._8_4_ * auVar120._8_4_;
                auVar83._12_4_ = auVar99._12_4_ * auVar82._12_4_ + auVar70._12_4_ * auVar120._12_4_;
LAB_0138387e:
                auVar69 = ZEXT816(0) << 0x40;
              }
              else {
                auVar82._8_4_ = 0xff800000;
                auVar82._0_8_ = 0xff800000ff800000;
                auVar82._12_4_ = 0xff800000;
                auVar120 = auVar82;
                auVar110 = auVar82;
                auVar111 = auVar82;
                if (iVar21 - iVar7 == 1) goto LAB_0138345f;
LAB_0138365b:
                auVar80 = vmaxss_avx(ZEXT416((uint)(fVar137 - fVar86)),ZEXT816(0));
                auVar87 = vshufps_avx(auVar80,auVar80,0);
                auVar80 = ZEXT416((uint)(1.0 - auVar80._0_4_));
                auVar80 = vshufps_avx(auVar80,auVar80,0);
                auVar97._0_4_ = auVar80._0_4_ * auVar69._0_4_ + auVar87._0_4_ * auVar70._0_4_;
                auVar97._4_4_ = auVar80._4_4_ * auVar69._4_4_ + auVar87._4_4_ * auVar70._4_4_;
                auVar97._8_4_ = auVar80._8_4_ * auVar69._8_4_ + auVar87._8_4_ * auVar70._8_4_;
                auVar97._12_4_ = auVar80._12_4_ * auVar69._12_4_ + auVar87._12_4_ * auVar70._12_4_;
                auVar100._0_4_ = auVar80._0_4_ * auVar82._0_4_ + auVar87._0_4_ * auVar110._0_4_;
                auVar100._4_4_ = auVar80._4_4_ * auVar82._4_4_ + auVar87._4_4_ * auVar110._4_4_;
                auVar100._8_4_ = auVar80._8_4_ * auVar82._8_4_ + auVar87._8_4_ * auVar110._8_4_;
                auVar100._12_4_ = auVar80._12_4_ * auVar82._12_4_ + auVar87._12_4_ * auVar110._12_4_
                ;
                auVar69 = vmaxss_avx(ZEXT416((uint)(fVar66 - fVar20)),ZEXT816(0));
                auVar70 = vshufps_avx(auVar69,auVar69,0);
                auVar69 = ZEXT416((uint)(1.0 - auVar69._0_4_));
                auVar69 = vshufps_avx(auVar69,auVar69,0);
                auVar74._0_4_ = auVar71._0_4_ * auVar69._0_4_ + auVar99._0_4_ * auVar70._0_4_;
                auVar74._4_4_ = auVar71._4_4_ * auVar69._4_4_ + auVar99._4_4_ * auVar70._4_4_;
                auVar74._8_4_ = auVar71._8_4_ * auVar69._8_4_ + auVar99._8_4_ * auVar70._8_4_;
                auVar74._12_4_ = auVar71._12_4_ * auVar69._12_4_ + auVar99._12_4_ * auVar70._12_4_;
                auVar83._0_4_ = auVar69._0_4_ * auVar120._0_4_ + auVar70._0_4_ * auVar111._0_4_;
                auVar83._4_4_ = auVar69._4_4_ * auVar120._4_4_ + auVar70._4_4_ * auVar111._4_4_;
                auVar83._8_4_ = auVar69._8_4_ * auVar120._8_4_ + auVar70._8_4_ * auVar111._8_4_;
                auVar83._12_4_ = auVar69._12_4_ * auVar120._12_4_ + auVar70._12_4_ * auVar111._12_4_
                ;
                if (iVar21 <= (int)(iVar7 + 1U)) {
                  auVar155 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)))
                  ;
                  goto LAB_0138387e;
                }
                uVar38 = (ulong)(iVar7 + 1U);
                auVar154._8_4_ = 0x7f800000;
                auVar154._0_8_ = 0x7f8000007f800000;
                auVar154._12_4_ = 0x7f800000;
                auVar155 = ZEXT1664(auVar154);
                auVar69 = ZEXT816(0) << 0x40;
                do {
                  auVar112._8_4_ = 0xff800000;
                  auVar112._0_8_ = 0xff800000ff800000;
                  auVar112._12_4_ = 0xff800000;
                  auVar71 = auVar154;
                  if (uVar42 < uVar5) {
                    uVar6 = *(ushort *)(lVar34 + 8 + lVar35);
                    uVar56 = (ulong)uVar6;
                    if (uVar50 + 3 < (ulong)uVar6) {
                      uVar56 = uVar50 + 3;
                    }
                    auVar153 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)
                                                 ));
                    auVar136 = ZEXT1664(auVar154);
                    uVar57 = uVar52;
                    do {
                      if (uVar47 < uVar6) {
                        lVar60 = *(long *)(*(long *)&pGVar11[2].numPrimitives + 0x10 + uVar38 * 0x38
                                          );
                        pauVar59 = (undefined1 (*) [16])
                                   ((*(uint *)(lVar34 + lVar35) + uVar50 +
                                    *(uint *)(lVar34 + 4 + lVar35) * uVar57) * lVar60 +
                                   *(long *)(*(long *)&pGVar11[2].numPrimitives + uVar38 * 0x38));
                        lVar61 = uVar56 - uVar50;
                        do {
                          auVar71 = *pauVar59;
                          auVar70 = vcmpps_avx(auVar71,auVar159,6);
                          auVar99 = vcmpps_avx(auVar71,auVar94,1);
                          auVar70 = vandps_avx(auVar70,auVar99);
                          uVar55 = vmovmskps_avx(auVar70);
                          if ((~(byte)uVar55 & 7) != 0) {
                            auVar112._8_4_ = 0xff800000;
                            auVar112._0_8_ = 0xff800000ff800000;
                            auVar112._12_4_ = 0xff800000;
                            auVar71 = auVar154;
                            goto LAB_013837f3;
                          }
                          auVar70 = vminps_avx(auVar136._0_16_,auVar71);
                          auVar136 = ZEXT1664(auVar70);
                          auVar71 = vmaxps_avx(auVar153._0_16_,auVar71);
                          auVar153 = ZEXT1664(auVar71);
                          pauVar59 = (undefined1 (*) [16])(*pauVar59 + lVar60);
                          lVar61 = lVar61 + -1;
                        } while (lVar61 != 0);
                      }
                      auVar112 = auVar153._0_16_;
                      auVar71 = auVar136._0_16_;
                      uVar57 = uVar57 + 1;
                    } while (uVar57 != uVar63);
                  }
LAB_013837f3:
                  auVar139._0_4_ = ((float)(int)uVar38 / fVar107 - fVar77) / (fVar127 - fVar77);
                  auVar139._4_12_ = SUB6012((undefined1  [60])0x0,0);
                  auVar70 = vshufps_avx(auVar139,auVar139,0);
                  fVar137 = auVar74._4_4_;
                  fVar12 = auVar74._8_4_;
                  fVar16 = auVar74._12_4_;
                  auVar99 = vshufps_avx(ZEXT416((uint)(1.0 - auVar139._0_4_)),
                                        ZEXT416((uint)(1.0 - auVar139._0_4_)),0);
                  fVar20 = auVar97._4_4_;
                  fVar13 = auVar97._8_4_;
                  fVar17 = auVar97._12_4_;
                  auVar147._0_4_ = auVar70._0_4_ * auVar74._0_4_ + auVar99._0_4_ * auVar97._0_4_;
                  auVar147._4_4_ = auVar70._4_4_ * fVar137 + auVar99._4_4_ * fVar20;
                  auVar147._8_4_ = auVar70._8_4_ * fVar12 + auVar99._8_4_ * fVar13;
                  auVar147._12_4_ = auVar70._12_4_ * fVar16 + auVar99._12_4_ * fVar17;
                  auVar71 = vsubps_avx(auVar71,auVar147);
                  fVar66 = auVar83._4_4_;
                  fVar14 = auVar83._8_4_;
                  fVar18 = auVar83._12_4_;
                  fVar86 = auVar100._4_4_;
                  fVar15 = auVar100._8_4_;
                  fVar19 = auVar100._12_4_;
                  auVar140._0_4_ = auVar70._0_4_ * auVar83._0_4_ + auVar99._0_4_ * auVar100._0_4_;
                  auVar140._4_4_ = auVar70._4_4_ * fVar66 + auVar99._4_4_ * fVar86;
                  auVar140._8_4_ = auVar70._8_4_ * fVar14 + auVar99._8_4_ * fVar15;
                  auVar140._12_4_ = auVar70._12_4_ * fVar18 + auVar99._12_4_ * fVar19;
                  auVar99 = vsubps_avx(auVar112,auVar140);
                  auVar70 = vminps_avx(auVar71,auVar69);
                  auVar71 = vmaxps_avx(auVar99,auVar69);
                  auVar97._0_4_ = auVar97._0_4_ + auVar70._0_4_;
                  auVar97._4_4_ = fVar20 + auVar70._4_4_;
                  auVar97._8_4_ = fVar13 + auVar70._8_4_;
                  auVar97._12_4_ = fVar17 + auVar70._12_4_;
                  auVar74._0_4_ = auVar74._0_4_ + auVar70._0_4_;
                  auVar74._4_4_ = fVar137 + auVar70._4_4_;
                  auVar74._8_4_ = fVar12 + auVar70._8_4_;
                  auVar74._12_4_ = fVar16 + auVar70._12_4_;
                  auVar100._0_4_ = auVar100._0_4_ + auVar71._0_4_;
                  auVar100._4_4_ = fVar86 + auVar71._4_4_;
                  auVar100._8_4_ = fVar15 + auVar71._8_4_;
                  auVar100._12_4_ = fVar19 + auVar71._12_4_;
                  auVar83._0_4_ = auVar83._0_4_ + auVar71._0_4_;
                  auVar83._4_4_ = fVar66 + auVar71._4_4_;
                  auVar83._8_4_ = fVar14 + auVar71._8_4_;
                  auVar83._12_4_ = fVar18 + auVar71._12_4_;
                  uVar38 = uVar38 + 1;
                } while (iVar21 != (int)uVar38);
              }
              auVar136 = ZEXT1664(auVar69);
              local_1e40 = vminps_avx(local_1e40,auVar97);
              auVar69 = vmaxps_avx(auVar158._0_16_,auVar100);
              auVar158 = ZEXT1664(auVar69);
              local_1e30 = vminps_avx(local_1e30,auVar74);
              auVar69 = vmaxps_avx(local_1cd0,auVar83);
              auVar153 = ZEXT1664(auVar69);
              *(undefined1 (*) [16])(local_1cb0 + uVar58 * 0x20) = auVar97;
              *(undefined1 (*) [16])
               ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)local_1ca0 + uVar58 * 2) = auVar100;
              *(undefined1 (*) [16])(local_1bc0 + (uVar58 * 8 + -2) * 4 + 8) = auVar74;
              *(undefined1 (*) [16])(local_1bb0 + uVar58 * 0x20) = auVar83;
              uVar58 = (ulong)((int)uVar58 + 1);
              uVar50 = local_1a78;
              pPVar64 = local_1a88;
              pcVar51 = local_1a70;
            }
            auVar69 = auVar136._0_16_;
            uVar33 = (uint)uVar50;
            lVar43 = lVar43 + 1;
            uVar52 = local_1d00;
            BVar53 = local_1cf8;
          } while (lVar43 != local_1e78);
        }
        aVar149 = auVar153._0_16_;
        aVar157 = auVar158._0_16_;
        lVar43 = local_1a98 * 0x90;
        pcVar4 = local_1cf0 + local_1a98 * 0x90;
        pcVar4[0] = '\0';
        pcVar4[1] = '\0';
        pcVar4[2] = '\0';
        pcVar4[3] = '\0';
        pcVar4[4] = -1;
        pcVar4[5] = -1;
        pcVar4[6] = -1;
        pcVar4[7] = -1;
        pcVar4[8] = '\0';
        pcVar4[9] = '\0';
        pcVar4[10] = '\0';
        pcVar4[0xb] = '\0';
        pcVar4[0xc] = -1;
        pcVar4[0xd] = -1;
        pcVar4[0xe] = -1;
        pcVar4[0xf] = -1;
        pcVar4[0x10] = '\0';
        pcVar4[0x11] = '\0';
        pcVar4[0x12] = '\0';
        pcVar4[0x13] = '\0';
        pcVar4[0x14] = -1;
        pcVar4[0x15] = -1;
        pcVar4[0x16] = -1;
        pcVar4[0x17] = -1;
        pcVar4[0x18] = '\0';
        pcVar4[0x19] = '\0';
        pcVar4[0x1a] = '\0';
        pcVar4[0x1b] = '\0';
        pcVar4[0x1c] = -1;
        pcVar4[0x1d] = -1;
        pcVar4[0x1e] = -1;
        pcVar4[0x1f] = -1;
        pcVar4 = local_1cf0 + (local_1a98 * 0x12 + 4) * 8;
        pcVar4[0] = -1;
        pcVar4[1] = -1;
        pcVar4[2] = -1;
        pcVar4[3] = -1;
        pcVar4 = local_1cf0 + (local_1a98 * 0x12 + 6) * 8;
        pcVar4[0] = -1;
        pcVar4[1] = -1;
        pcVar4[2] = -1;
        pcVar4[3] = -1;
        pcVar4 = local_1cf0 + (local_1a98 * 0x12 + 5) * 8;
        pcVar4[0] = -1;
        pcVar4[1] = -1;
        pcVar4[2] = -1;
        pcVar4[3] = -1;
        pcVar4 = local_1cf0 + local_1a98 * 0x90 + 0x24;
        pcVar4[0] = '\0';
        pcVar4[1] = '\0';
        pcVar4[2] = '\0';
        pcVar4[3] = '\0';
        pcVar4 = local_1cf0 + lVar43 + 0x34;
        pcVar4[0] = '\0';
        pcVar4[1] = '\0';
        pcVar4[2] = '\0';
        pcVar4[3] = '\0';
        pcVar4 = local_1cf0 + lVar43 + 0x2c;
        pcVar4[0] = '\0';
        pcVar4[1] = '\0';
        pcVar4[2] = '\0';
        pcVar4[3] = '\0';
        pcVar4 = local_1cf0 + (local_1a98 * 0x12 + 10) * 8;
        pcVar4[0] = -1;
        pcVar4[1] = -1;
        pcVar4[2] = -1;
        pcVar4[3] = -1;
        pcVar4 = local_1cf0 + (local_1a98 * 0x12 + 0xc) * 8;
        pcVar4[0] = -1;
        pcVar4[1] = -1;
        pcVar4[2] = -1;
        pcVar4[3] = -1;
        pcVar4 = local_1cf0 + (local_1a98 * 0x12 + 0xb) * 8;
        pcVar4[0] = -1;
        pcVar4[1] = -1;
        pcVar4[2] = -1;
        pcVar4[3] = -1;
        pcVar4 = local_1cf0 + local_1a98 * 0x90 + 0x54;
        pcVar4[0] = '\0';
        pcVar4[1] = '\0';
        pcVar4[2] = '\0';
        pcVar4[3] = '\0';
        pcVar4 = local_1cf0 + lVar43 + 100;
        pcVar4[0] = '\0';
        pcVar4[1] = '\0';
        pcVar4[2] = '\0';
        pcVar4[3] = '\0';
        pcVar4 = local_1cf0 + lVar43 + 0x5c;
        pcVar4[0] = '\0';
        pcVar4[1] = '\0';
        pcVar4[2] = '\0';
        pcVar4[3] = '\0';
        *(uint *)(local_1cf0 + (local_1a98 * 0x12 + 0x11) * 8) = uVar33;
        *(float *)(local_1cf0 + (local_1a98 * 0x12 + 0x10) * 8) = fVar85;
        *(float *)(local_1cf0 + lVar43 + 0x84) = 1.0 / (fVar91 - fVar85);
        _aVar160 = auVar155._0_16_;
        local_11e0 = _aVar160;
        local_1200 = _aVar160;
        local_1220 = _aVar160;
        local_11d0._M_allocated_capacity._0_4_ = 0xff800000;
        local_11d0._M_allocated_capacity._4_4_ = 0xff800000;
        local_11d0._8_4_ = 0xff800000;
        local_11d0._12_4_ = 0xff800000;
        local_11f0._8_4_ = 0xff800000;
        local_11f0._M_allocated_capacity = 0xff800000ff800000;
        local_11f0._12_4_ = 0xff800000;
        local_1210._8_4_ = 0xff800000;
        local_1210._M_allocated_capacity = 0xff800000ff800000;
        local_1210._12_4_ = 0xff800000;
        local_1240._0_8_ = 8;
        local_1240._8_8_ = 8;
        BStack_1228 = (BBox1f)0x8;
        local_1240._16_8_ = 8;
        _local_17e0 = _aVar160;
        _local_1800 = _aVar160;
        _local_1820 = _aVar160;
        local_17d0[0] = 0xff800000;
        local_17d0[1] = 0xff800000;
        local_17d0[2] = 0xff800000;
        local_17d0[3] = 0xff800000;
        local_17f0.lower = -INFINITY;
        local_17f0.upper = -INFINITY;
        uStack_17e8 = 0xff800000;
        uStack_17e4 = 0xff800000;
        local_1810[0] = 0xff800000;
        local_1810[1] = 0xff800000;
        local_1810[2] = 0xff800000;
        local_1810[3] = 0xff800000;
        local_1840.lower = 1.12104e-44;
        local_1840.upper = 0.0;
        sStack_1838 = 8;
        BStack_1830.lower = 1.12104e-44;
        BStack_1830.upper = 0.0;
        BStack_1828.lower = 1.12104e-44;
        BStack_1828.upper = 0.0;
        if ((int)uVar58 != 0) {
          lVar34 = 0;
          do {
            *(ulong *)(pcVar51 + lVar34 * 2) =
                 CONCAT44(*(undefined4 *)(local_19b0 + lVar34),
                          *(int *)(local_1a50 + lVar34 + 0x10) << 0x10 |
                          (uint)*(ushort *)((long)&local_1d90 + lVar34));
            uVar55 = *(undefined4 *)(local_1cb0 + lVar34 * 8 + 4);
            *(undefined4 *)((long)&local_1220 + lVar34) = *(undefined4 *)(local_1cb0 + lVar34 * 8);
            *(undefined4 *)((long)&local_1200 + lVar34) = uVar55;
            *(undefined4 *)((long)&local_11e0 + lVar34) =
                 *(undefined4 *)(local_1cb0 + lVar34 * 8 + 8);
            *(undefined4 *)(local_1210._M_local_buf + lVar34) =
                 *(undefined4 *)((long)local_1ca0 + lVar34 * 8);
            *(undefined4 *)(local_11f0._M_local_buf + lVar34) =
                 *(undefined4 *)((long)local_1ca0 + lVar34 * 8 + 4);
            *(undefined4 *)((long)&local_11d0 + lVar34) =
                 *(undefined4 *)((long)local_1ca0 + lVar34 * 8 + 8);
            uVar55 = *(undefined4 *)(local_1bc0 + (lVar34 * 2 + -1) * 4 + 8);
            *(undefined4 *)((long)&local_1820.x + lVar34) =
                 *(undefined4 *)(local_1bc0 + (lVar34 * 2 + -2) * 4 + 8);
            *(undefined4 *)((long)&local_1800.x + lVar34) = uVar55;
            *(undefined4 *)((long)&local_17e0.x + lVar34) =
                 *(undefined4 *)(local_1bc0 + lVar34 * 8 + 8);
            *(undefined4 *)((long)local_1810 + lVar34) = *(undefined4 *)(local_1bb0 + lVar34 * 8);
            uVar55 = *(undefined4 *)(local_1bb0 + lVar34 * 8 + 8);
            *(undefined4 *)((long)&local_17f0.lower + lVar34) =
                 *(undefined4 *)(local_1bb0 + lVar34 * 8 + 4);
            *(undefined4 *)((long)local_17d0 + lVar34) = uVar55;
            lVar34 = lVar34 + 4;
          } while (uVar58 << 2 != lVar34);
        }
        auVar71 = vshufps_avx((undefined1  [16])local_1220,(undefined1  [16])local_1220,0xb1);
        auVar71 = vminps_avx(auVar71,(undefined1  [16])local_1220);
        auVar70 = vshufpd_avx(auVar71,auVar71,1);
        auVar80 = vminps_avx(auVar70,auVar71);
        auVar71 = vshufps_avx((undefined1  [16])local_1210,(undefined1  [16])local_1210,0xb1);
        auVar71 = vmaxps_avx(auVar71,(undefined1  [16])local_1210);
        auVar70 = vshufpd_avx(auVar71,auVar71,1);
        auVar71 = vmaxss_avx(auVar70,auVar71);
        fVar85 = (auVar71._0_4_ - auVar80._0_4_) * 1.0000002;
        auVar71 = vcmpss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(fVar85 / 255.0)),0);
        auVar70 = vblendvps_avx(ZEXT416((uint)(fVar85 / 255.0)),SUB6416(ZEXT464(0x1000000),0),
                                auVar71);
        auVar71 = vcmpss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)fVar85),1);
        auVar71 = vandps_avx(auVar71,ZEXT416((uint)(255.0 / fVar85)));
        auVar81 = vshufps_avx(auVar80,auVar80,0);
        auVar87 = vsubps_avx((undefined1  [16])local_1220,auVar81);
        auVar99 = vshufps_avx(auVar71,auVar71,0);
        auVar121._0_4_ = auVar87._0_4_ * auVar99._0_4_;
        auVar121._4_4_ = auVar87._4_4_ * auVar99._4_4_;
        auVar121._8_4_ = auVar87._8_4_ * auVar99._8_4_;
        auVar121._12_4_ = auVar87._12_4_ * auVar99._12_4_;
        auVar71 = vroundps_avx(auVar121,1);
        auVar71 = vcvtps2dq_avx(auVar71);
        auVar87 = vpmaxsd_avx(auVar71,auVar69);
        auVar69 = vsubps_avx((undefined1  [16])local_1210,auVar81);
        auVar101._0_4_ = auVar69._0_4_ * auVar99._0_4_;
        auVar101._4_4_ = auVar69._4_4_ * auVar99._4_4_;
        auVar101._8_4_ = auVar69._8_4_ * auVar99._8_4_;
        auVar101._12_4_ = auVar69._12_4_ * auVar99._12_4_;
        auVar69 = vroundps_avx(auVar101,2);
        auVar69 = vcvtps2dq_avx(auVar69);
        auVar148._8_4_ = 0xff;
        auVar148._0_8_ = 0xff000000ff;
        auVar148._12_4_ = 0xff;
        auVar72 = vpminsd_avx(auVar69,auVar148);
        auVar69 = vcvtdq2ps_avx(auVar87);
        auVar88 = vshufps_avx(auVar70,auVar70,0);
        auVar99 = vcvtdq2ps_avx(auVar72);
        auVar71 = vcmpps_avx((undefined1  [16])_aVar160,(undefined1  [16])local_1220,4);
        auVar130._0_4_ = auVar88._0_4_ * auVar69._0_4_ + auVar81._0_4_;
        auVar130._4_4_ = auVar88._4_4_ * auVar69._4_4_ + auVar81._4_4_;
        auVar130._8_4_ = auVar88._8_4_ * auVar69._8_4_ + auVar81._8_4_;
        auVar130._12_4_ = auVar88._12_4_ * auVar69._12_4_ + auVar81._12_4_;
        auVar113._0_4_ = auVar88._0_4_ * auVar99._0_4_ + auVar81._0_4_;
        auVar113._4_4_ = auVar88._4_4_ * auVar99._4_4_ + auVar81._4_4_;
        auVar113._8_4_ = auVar88._8_4_ * auVar99._8_4_ + auVar81._8_4_;
        auVar113._12_4_ = auVar88._12_4_ * auVar99._12_4_ + auVar81._12_4_;
        auVar69 = vcmpps_avx(auVar130,(undefined1  [16])local_1220,6);
        auVar69 = vpaddd_avx(auVar87,auVar69);
        auVar99 = vpmaxsd_avx(auVar69,_DAT_01f7aa10);
        auVar69 = vcmpps_avx(auVar113,(undefined1  [16])local_1210,1);
        auVar69 = vpsubd_avx(auVar72,auVar69);
        auVar87 = vpminsd_avx(auVar69,auVar148);
        auVar69 = vblendvps_avx(auVar148,auVar99,auVar71);
        auVar99 = vpackusdw_avx(auVar69,auVar69);
        auVar69 = vandps_avx(auVar71,auVar87);
        auVar69 = vpackusdw_avx(auVar69,auVar69);
        auVar69 = vpackuswb_avx(auVar99,auVar69);
        auVar69 = vpshufd_avx(auVar69,0xd8);
        *(long *)(local_1cf0 + (local_1a98 * 0x12 + 4) * 8) = auVar69._0_8_;
        *(float *)(local_1cf0 + (local_1a98 * 0x12 + 7) * 8) = auVar80._0_4_;
        *(int *)(local_1cf0 + lVar43 + 0x44) = auVar70._0_4_;
        auVar69 = vshufps_avx((undefined1  [16])local_1200,(undefined1  [16])local_1200,0xb1);
        auVar69 = vminps_avx(auVar69,(undefined1  [16])local_1200);
        auVar71 = vshufpd_avx(auVar69,auVar69,1);
        auVar80 = vminps_avx(auVar71,auVar69);
        auVar69 = vshufps_avx((undefined1  [16])local_11f0,(undefined1  [16])local_11f0,0xb1);
        auVar69 = vmaxps_avx(auVar69,(undefined1  [16])local_11f0);
        auVar71 = vshufpd_avx(auVar69,auVar69,1);
        auVar69 = vmaxss_avx(auVar71,auVar69);
        fVar85 = (auVar69._0_4_ - auVar80._0_4_) * 1.0000002;
        auVar69 = vcmpss_avx(ZEXT416(0) << 0x20,ZEXT416((uint)(fVar85 / 255.0)),0);
        auVar71 = vblendvps_avx(ZEXT416((uint)(fVar85 / 255.0)),SUB6416(ZEXT464(0x1000000),0),
                                auVar69);
        auVar69 = vcmpss_avx(ZEXT416(0) << 0x20,ZEXT416((uint)fVar85),1);
        auVar69 = vandps_avx(auVar69,ZEXT416((uint)(255.0 / fVar85)));
        auVar81 = vshufps_avx(auVar80,auVar80,0);
        auVar99 = vsubps_avx((undefined1  [16])local_1200,auVar81);
        auVar70 = vshufps_avx(auVar69,auVar69,0);
        auVar122._0_4_ = auVar99._0_4_ * auVar70._0_4_;
        auVar122._4_4_ = auVar99._4_4_ * auVar70._4_4_;
        auVar122._8_4_ = auVar99._8_4_ * auVar70._8_4_;
        auVar122._12_4_ = auVar99._12_4_ * auVar70._12_4_;
        auVar69 = vroundps_avx(auVar122,1);
        auVar69 = vcvtps2dq_avx(auVar69);
        auVar87 = vpmaxsd_avx(auVar69,_DAT_01f7aa10);
        auVar69 = vsubps_avx((undefined1  [16])local_11f0,auVar81);
        auVar102._0_4_ = auVar69._0_4_ * auVar70._0_4_;
        auVar102._4_4_ = auVar69._4_4_ * auVar70._4_4_;
        auVar102._8_4_ = auVar69._8_4_ * auVar70._8_4_;
        auVar102._12_4_ = auVar69._12_4_ * auVar70._12_4_;
        auVar69 = vroundps_avx(auVar102,2);
        auVar69 = vcvtps2dq_avx(auVar69);
        auVar72 = vpminsd_avx(auVar69,auVar148);
        auVar69 = vcvtdq2ps_avx(auVar87);
        auVar88 = vshufps_avx(auVar71,auVar71,0);
        auVar99 = vcvtdq2ps_avx(auVar72);
        auVar70 = vcmpps_avx((undefined1  [16])_aVar160,(undefined1  [16])local_1200,4);
        auVar131._0_4_ = auVar88._0_4_ * auVar69._0_4_ + auVar81._0_4_;
        auVar131._4_4_ = auVar88._4_4_ * auVar69._4_4_ + auVar81._4_4_;
        auVar131._8_4_ = auVar88._8_4_ * auVar69._8_4_ + auVar81._8_4_;
        auVar131._12_4_ = auVar88._12_4_ * auVar69._12_4_ + auVar81._12_4_;
        auVar114._0_4_ = auVar88._0_4_ * auVar99._0_4_ + auVar81._0_4_;
        auVar114._4_4_ = auVar88._4_4_ * auVar99._4_4_ + auVar81._4_4_;
        auVar114._8_4_ = auVar88._8_4_ * auVar99._8_4_ + auVar81._8_4_;
        auVar114._12_4_ = auVar88._12_4_ * auVar99._12_4_ + auVar81._12_4_;
        auVar69 = vcmpps_avx(auVar131,(undefined1  [16])local_1200,6);
        auVar69 = vpaddd_avx(auVar87,auVar69);
        auVar99 = vpmaxsd_avx(auVar69,_DAT_01f7aa10);
        auVar69 = vcmpps_avx(auVar114,(undefined1  [16])local_11f0,1);
        auVar69 = vpsubd_avx(auVar72,auVar69);
        auVar87 = vpminsd_avx(auVar69,auVar148);
        auVar69 = vblendvps_avx(auVar148,auVar99,auVar70);
        auVar99 = vpackusdw_avx(auVar69,auVar69);
        auVar69 = vandps_avx(auVar70,auVar87);
        auVar69 = vpackusdw_avx(auVar69,auVar69);
        auVar69 = vpackuswb_avx(auVar99,auVar69);
        auVar69 = vpshufd_avx(auVar69,0xd8);
        *(long *)(local_1cf0 + (local_1a98 * 0x12 + 5) * 8) = auVar69._0_8_;
        *(float *)(local_1cf0 + lVar43 + 0x3c) = auVar80._0_4_;
        *(int *)(local_1cf0 + (local_1a98 * 0x12 + 9) * 8) = auVar71._0_4_;
        auVar29._4_4_ = local_11d0._M_allocated_capacity._4_4_;
        auVar29._0_4_ = local_11d0._M_allocated_capacity._0_4_;
        auVar29._8_4_ = local_11d0._8_4_;
        auVar29._12_4_ = local_11d0._12_4_;
        auVar69 = vshufps_avx((undefined1  [16])local_11e0,(undefined1  [16])local_11e0,0xb1);
        auVar69 = vminps_avx(auVar69,(undefined1  [16])local_11e0);
        auVar71 = vshufpd_avx(auVar69,auVar69,1);
        auVar80 = vminps_avx(auVar71,auVar69);
        auVar69 = vshufps_avx(auVar29,auVar29,0xb1);
        auVar69 = vmaxps_avx(auVar69,auVar29);
        auVar71 = vshufpd_avx(auVar69,auVar69,1);
        auVar69 = vmaxss_avx(auVar71,auVar69);
        fVar85 = (auVar69._0_4_ - auVar80._0_4_) * 1.0000002;
        auVar69 = vcmpss_avx(ZEXT416((uint)(fVar85 / 255.0)),ZEXT816(0) << 0x20,0);
        auVar71 = vblendvps_avx(ZEXT416((uint)(fVar85 / 255.0)),SUB6416(ZEXT464(0x1000000),0),
                                auVar69);
        auVar69 = vcmpss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)fVar85),1);
        auVar69 = vandps_avx(auVar69,ZEXT416((uint)(255.0 / fVar85)));
        auVar81 = vshufps_avx(auVar80,auVar80,0);
        auVar99 = vsubps_avx((undefined1  [16])local_11e0,auVar81);
        auVar70 = vshufps_avx(auVar69,auVar69,0);
        auVar123._0_4_ = auVar99._0_4_ * auVar70._0_4_;
        auVar123._4_4_ = auVar99._4_4_ * auVar70._4_4_;
        auVar123._8_4_ = auVar99._8_4_ * auVar70._8_4_;
        auVar123._12_4_ = auVar99._12_4_ * auVar70._12_4_;
        auVar69 = vroundps_avx(auVar123,1);
        auVar69 = vcvtps2dq_avx(auVar69);
        auVar87 = vpmaxsd_avx(auVar69,_DAT_01f7aa10);
        auVar69 = vsubps_avx(auVar29,auVar81);
        auVar103._0_4_ = auVar69._0_4_ * auVar70._0_4_;
        auVar103._4_4_ = auVar69._4_4_ * auVar70._4_4_;
        auVar103._8_4_ = auVar69._8_4_ * auVar70._8_4_;
        auVar103._12_4_ = auVar69._12_4_ * auVar70._12_4_;
        auVar69 = vroundps_avx(auVar103,2);
        auVar69 = vcvtps2dq_avx(auVar69);
        auVar72 = vpminsd_avx(auVar69,auVar148);
        auVar69 = vcvtdq2ps_avx(auVar87);
        auVar88 = vshufps_avx(auVar71,auVar71,0);
        auVar99 = vcvtdq2ps_avx(auVar72);
        auVar70 = vcmpps_avx((undefined1  [16])_aVar160,(undefined1  [16])local_11e0,4);
        auVar132._0_4_ = auVar88._0_4_ * auVar69._0_4_ + auVar81._0_4_;
        auVar132._4_4_ = auVar88._4_4_ * auVar69._4_4_ + auVar81._4_4_;
        auVar132._8_4_ = auVar88._8_4_ * auVar69._8_4_ + auVar81._8_4_;
        auVar132._12_4_ = auVar88._12_4_ * auVar69._12_4_ + auVar81._12_4_;
        auVar115._0_4_ = auVar88._0_4_ * auVar99._0_4_ + auVar81._0_4_;
        auVar115._4_4_ = auVar88._4_4_ * auVar99._4_4_ + auVar81._4_4_;
        auVar115._8_4_ = auVar88._8_4_ * auVar99._8_4_ + auVar81._8_4_;
        auVar115._12_4_ = auVar88._12_4_ * auVar99._12_4_ + auVar81._12_4_;
        auVar69 = vcmpps_avx(auVar132,(undefined1  [16])local_11e0,6);
        auVar69 = vpaddd_avx(auVar87,auVar69);
        auVar99 = vpmaxsd_avx(auVar69,_DAT_01f7aa10);
        auVar69 = vcmpps_avx(auVar115,auVar29,1);
        auVar69 = vpsubd_avx(auVar72,auVar69);
        auVar87 = vpminsd_avx(auVar69,auVar148);
        auVar69 = vblendvps_avx(auVar148,auVar99,auVar70);
        auVar99 = vpackusdw_avx(auVar69,auVar69);
        auVar69 = vandps_avx(auVar70,auVar87);
        auVar69 = vpackusdw_avx(auVar69,auVar69);
        auVar69 = vpackuswb_avx(auVar99,auVar69);
        auVar69 = vpshufd_avx(auVar69,0xd8);
        *(long *)(local_1cf0 + (local_1a98 * 0x12 + 6) * 8) = auVar69._0_8_;
        *(float *)(local_1cf0 + (local_1a98 * 0x12 + 8) * 8) = auVar80._0_4_;
        *(int *)(local_1cf0 + lVar43 + 0x4c) = auVar71._0_4_;
        auVar26._4_4_ = local_1810[1];
        auVar26._0_4_ = local_1810[0];
        auVar26._8_4_ = local_1810[2];
        auVar26._12_4_ = local_1810[3];
        auVar69 = vshufps_avx((undefined1  [16])_local_1820,(undefined1  [16])_local_1820,0xb1);
        auVar69 = vminps_avx(auVar69,(undefined1  [16])_local_1820);
        auVar71 = vshufpd_avx(auVar69,auVar69,1);
        auVar80 = vminps_avx(auVar71,auVar69);
        auVar69 = vshufps_avx(auVar26,auVar26,0xb1);
        auVar69 = vmaxps_avx(auVar69,auVar26);
        auVar71 = vshufpd_avx(auVar69,auVar69,1);
        auVar69 = vmaxss_avx(auVar71,auVar69);
        fVar85 = (auVar69._0_4_ - auVar80._0_4_) * 1.0000002;
        auVar69 = vcmpss_avx(ZEXT416(0) << 0x20,ZEXT416((uint)(fVar85 / 255.0)),0);
        auVar71 = vblendvps_avx(ZEXT416((uint)(fVar85 / 255.0)),SUB6416(ZEXT464(0x1000000),0),
                                auVar69);
        auVar69 = vcmpss_avx(ZEXT416(0) << 0x20,ZEXT416((uint)fVar85),1);
        auVar69 = vandps_avx(auVar69,ZEXT416((uint)(255.0 / fVar85)));
        auVar81 = vshufps_avx(auVar80,auVar80,0);
        auVar99 = vsubps_avx((undefined1  [16])_local_1820,auVar81);
        auVar70 = vshufps_avx(auVar69,auVar69,0);
        auVar124._0_4_ = auVar99._0_4_ * auVar70._0_4_;
        auVar124._4_4_ = auVar99._4_4_ * auVar70._4_4_;
        auVar124._8_4_ = auVar99._8_4_ * auVar70._8_4_;
        auVar124._12_4_ = auVar99._12_4_ * auVar70._12_4_;
        auVar69 = vroundps_avx(auVar124,1);
        auVar69 = vcvtps2dq_avx(auVar69);
        auVar87 = vpmaxsd_avx(auVar69,_DAT_01f7aa10);
        auVar69 = vsubps_avx(auVar26,auVar81);
        auVar104._0_4_ = auVar69._0_4_ * auVar70._0_4_;
        auVar104._4_4_ = auVar69._4_4_ * auVar70._4_4_;
        auVar104._8_4_ = auVar69._8_4_ * auVar70._8_4_;
        auVar104._12_4_ = auVar69._12_4_ * auVar70._12_4_;
        auVar69 = vroundps_avx(auVar104,2);
        auVar69 = vcvtps2dq_avx(auVar69);
        auVar72 = vpminsd_avx(auVar69,auVar148);
        auVar69 = vcvtdq2ps_avx(auVar87);
        auVar88 = vshufps_avx(auVar71,auVar71,0);
        auVar99 = vcvtdq2ps_avx(auVar72);
        auVar70 = vcmpps_avx((undefined1  [16])_aVar160,(undefined1  [16])_local_1820,4);
        auVar133._0_4_ = auVar88._0_4_ * auVar69._0_4_ + auVar81._0_4_;
        auVar133._4_4_ = auVar88._4_4_ * auVar69._4_4_ + auVar81._4_4_;
        auVar133._8_4_ = auVar88._8_4_ * auVar69._8_4_ + auVar81._8_4_;
        auVar133._12_4_ = auVar88._12_4_ * auVar69._12_4_ + auVar81._12_4_;
        auVar116._0_4_ = auVar88._0_4_ * auVar99._0_4_ + auVar81._0_4_;
        auVar116._4_4_ = auVar88._4_4_ * auVar99._4_4_ + auVar81._4_4_;
        auVar116._8_4_ = auVar88._8_4_ * auVar99._8_4_ + auVar81._8_4_;
        auVar116._12_4_ = auVar88._12_4_ * auVar99._12_4_ + auVar81._12_4_;
        auVar69 = vcmpps_avx(auVar133,(undefined1  [16])_local_1820,6);
        auVar69 = vpaddd_avx(auVar87,auVar69);
        auVar99 = vpmaxsd_avx(auVar69,_DAT_01f7aa10);
        auVar69 = vcmpps_avx(auVar116,auVar26,1);
        auVar69 = vpsubd_avx(auVar72,auVar69);
        auVar87 = vpminsd_avx(auVar69,auVar148);
        auVar69 = vblendvps_avx(auVar148,auVar99,auVar70);
        auVar99 = vpackusdw_avx(auVar69,auVar69);
        auVar69 = vandps_avx(auVar70,auVar87);
        auVar69 = vpackusdw_avx(auVar69,auVar69);
        auVar69 = vpackuswb_avx(auVar99,auVar69);
        auVar69 = vpshufd_avx(auVar69,0xd8);
        *(long *)(local_1cf0 + (local_1a98 * 0x12 + 10) * 8) = auVar69._0_8_;
        *(float *)(local_1cf0 + (local_1a98 * 0x12 + 0xd) * 8) = auVar80._0_4_;
        *(int *)(local_1cf0 + lVar43 + 0x74) = auVar71._0_4_;
        auVar27._4_4_ = local_17f0.upper;
        auVar27._0_4_ = local_17f0.lower;
        auVar27._8_4_ = uStack_17e8;
        auVar27._12_4_ = uStack_17e4;
        auVar69 = vshufps_avx((undefined1  [16])_local_1800,(undefined1  [16])_local_1800,0xb1);
        auVar69 = vminps_avx(auVar69,(undefined1  [16])_local_1800);
        auVar71 = vshufpd_avx(auVar69,auVar69,1);
        auVar80 = vminps_avx(auVar71,auVar69);
        auVar69 = vshufps_avx(auVar27,auVar27,0xb1);
        auVar69 = vmaxps_avx(auVar69,auVar27);
        auVar71 = vshufpd_avx(auVar69,auVar69,1);
        auVar69 = vmaxss_avx(auVar71,auVar69);
        fVar85 = (auVar69._0_4_ - auVar80._0_4_) * 1.0000002;
        auVar69 = vcmpss_avx(ZEXT416((uint)(fVar85 / 255.0)),ZEXT816(0) << 0x20,0);
        auVar71 = vblendvps_avx(ZEXT416((uint)(fVar85 / 255.0)),SUB6416(ZEXT464(0x1000000),0),
                                auVar69);
        auVar69 = vcmpss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)fVar85),1);
        auVar69 = vandps_avx(auVar69,ZEXT416((uint)(255.0 / fVar85)));
        auVar81 = vshufps_avx(auVar80,auVar80,0);
        auVar99 = vsubps_avx((undefined1  [16])_local_1800,auVar81);
        auVar70 = vshufps_avx(auVar69,auVar69,0);
        auVar125._0_4_ = auVar99._0_4_ * auVar70._0_4_;
        auVar125._4_4_ = auVar99._4_4_ * auVar70._4_4_;
        auVar125._8_4_ = auVar99._8_4_ * auVar70._8_4_;
        auVar125._12_4_ = auVar99._12_4_ * auVar70._12_4_;
        auVar69 = vroundps_avx(auVar125,1);
        auVar69 = vcvtps2dq_avx(auVar69);
        auVar87 = vpmaxsd_avx(auVar69,_DAT_01f7aa10);
        auVar69 = vsubps_avx(auVar27,auVar81);
        auVar105._0_4_ = auVar69._0_4_ * auVar70._0_4_;
        auVar105._4_4_ = auVar69._4_4_ * auVar70._4_4_;
        auVar105._8_4_ = auVar69._8_4_ * auVar70._8_4_;
        auVar105._12_4_ = auVar69._12_4_ * auVar70._12_4_;
        auVar69 = vroundps_avx(auVar105,2);
        auVar69 = vcvtps2dq_avx(auVar69);
        auVar72 = vpminsd_avx(auVar69,auVar148);
        auVar69 = vcvtdq2ps_avx(auVar87);
        auVar88 = vshufps_avx(auVar71,auVar71,0);
        auVar99 = vcvtdq2ps_avx(auVar72);
        auVar70 = vcmpps_avx((undefined1  [16])_aVar160,(undefined1  [16])_local_1800,4);
        auVar134._0_4_ = auVar88._0_4_ * auVar69._0_4_ + auVar81._0_4_;
        auVar134._4_4_ = auVar88._4_4_ * auVar69._4_4_ + auVar81._4_4_;
        auVar134._8_4_ = auVar88._8_4_ * auVar69._8_4_ + auVar81._8_4_;
        auVar134._12_4_ = auVar88._12_4_ * auVar69._12_4_ + auVar81._12_4_;
        auVar117._0_4_ = auVar88._0_4_ * auVar99._0_4_ + auVar81._0_4_;
        auVar117._4_4_ = auVar88._4_4_ * auVar99._4_4_ + auVar81._4_4_;
        auVar117._8_4_ = auVar88._8_4_ * auVar99._8_4_ + auVar81._8_4_;
        auVar117._12_4_ = auVar88._12_4_ * auVar99._12_4_ + auVar81._12_4_;
        auVar69 = vcmpps_avx(auVar134,(undefined1  [16])_local_1800,6);
        auVar69 = vpaddd_avx(auVar87,auVar69);
        auVar99 = vpmaxsd_avx(auVar69,_DAT_01f7aa10);
        auVar69 = vcmpps_avx(auVar117,auVar27,1);
        auVar69 = vpsubd_avx(auVar72,auVar69);
        auVar87 = vpminsd_avx(auVar69,auVar148);
        auVar69 = vblendvps_avx(auVar148,auVar99,auVar70);
        auVar99 = vpackusdw_avx(auVar69,auVar69);
        auVar69 = vandps_avx(auVar70,auVar87);
        auVar69 = vpackusdw_avx(auVar69,auVar69);
        auVar69 = vpackuswb_avx(auVar99,auVar69);
        auVar69 = vpshufd_avx(auVar69,0xd8);
        *(long *)(local_1cf0 + (local_1a98 * 0x12 + 0xb) * 8) = auVar69._0_8_;
        *(float *)(local_1cf0 + lVar43 + 0x6c) = auVar80._0_4_;
        *(int *)(local_1cf0 + (local_1a98 * 0x12 + 0xf) * 8) = auVar71._0_4_;
        auVar28._4_4_ = local_17d0[1];
        auVar28._0_4_ = local_17d0[0];
        auVar28._8_4_ = local_17d0[2];
        auVar28._12_4_ = local_17d0[3];
        auVar69 = vshufps_avx((undefined1  [16])_local_17e0,(undefined1  [16])_local_17e0,0xb1);
        auVar69 = vminps_avx(auVar69,(undefined1  [16])_local_17e0);
        auVar71 = vshufpd_avx(auVar69,auVar69,1);
        auVar80 = vminps_avx(auVar71,auVar69);
        auVar69 = vshufps_avx(auVar28,auVar28,0xb1);
        auVar69 = vmaxps_avx(auVar69,auVar28);
        auVar71 = vshufpd_avx(auVar69,auVar69,1);
        auVar69 = vmaxss_avx(auVar71,auVar69);
        fVar85 = (auVar69._0_4_ - auVar80._0_4_) * 1.0000002;
        auVar69 = vcmpss_avx(ZEXT416((uint)(fVar85 / 255.0)),ZEXT816(0) << 0x20,0);
        auVar70 = vblendvps_avx(ZEXT416((uint)(fVar85 / 255.0)),SUB6416(ZEXT464(0x1000000),0),
                                auVar69);
        auVar69 = vcmpss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)fVar85),1);
        auVar69 = vandps_avx(auVar69,ZEXT416((uint)(255.0 / fVar85)));
        auVar72 = vshufps_avx(auVar80,auVar80,0);
        auVar99 = vsubps_avx((undefined1  [16])_local_17e0,auVar72);
        auVar71 = vshufps_avx(auVar69,auVar69,0);
        auVar126._0_4_ = auVar99._0_4_ * auVar71._0_4_;
        auVar126._4_4_ = auVar99._4_4_ * auVar71._4_4_;
        auVar126._8_4_ = auVar99._8_4_ * auVar71._8_4_;
        auVar126._12_4_ = auVar99._12_4_ * auVar71._12_4_;
        auVar69 = vroundps_avx(auVar126,1);
        auVar69 = vcvtps2dq_avx(auVar69);
        auVar99 = vpmaxsd_avx(auVar69,_DAT_01f7aa10);
        auVar69 = vsubps_avx(auVar28,auVar72);
        auVar106._0_4_ = auVar69._0_4_ * auVar71._0_4_;
        auVar106._4_4_ = auVar69._4_4_ * auVar71._4_4_;
        auVar106._8_4_ = auVar69._8_4_ * auVar71._8_4_;
        auVar106._12_4_ = auVar69._12_4_ * auVar71._12_4_;
        auVar69 = vroundps_avx(auVar106,2);
        auVar69 = vcvtps2dq_avx(auVar69);
        auVar87 = vpminsd_avx(auVar69,auVar148);
        auVar69 = vcvtdq2ps_avx(auVar99);
        auVar81 = vshufps_avx(auVar70,auVar70,0);
        auVar71 = vcvtdq2ps_avx(auVar87);
        auVar135._0_4_ = auVar81._0_4_ * auVar69._0_4_ + auVar72._0_4_;
        auVar135._4_4_ = auVar81._4_4_ * auVar69._4_4_ + auVar72._4_4_;
        auVar135._8_4_ = auVar81._8_4_ * auVar69._8_4_ + auVar72._8_4_;
        auVar135._12_4_ = auVar81._12_4_ * auVar69._12_4_ + auVar72._12_4_;
        auVar118._0_4_ = auVar81._0_4_ * auVar71._0_4_ + auVar72._0_4_;
        auVar118._4_4_ = auVar81._4_4_ * auVar71._4_4_ + auVar72._4_4_;
        auVar118._8_4_ = auVar81._8_4_ * auVar71._8_4_ + auVar72._8_4_;
        auVar118._12_4_ = auVar81._12_4_ * auVar71._12_4_ + auVar72._12_4_;
        auVar69 = vcmpps_avx(auVar135,(undefined1  [16])_local_17e0,6);
        auVar99 = vpaddd_avx(auVar69,auVar99);
        auVar69 = (undefined1  [16])0x0;
        auVar71 = vcmpps_avx(auVar118,auVar28,1);
        auVar87 = vpsubd_avx(auVar87,auVar71);
        auVar71 = vcmpps_avx((undefined1  [16])_aVar160,(undefined1  [16])_local_17e0,4);
        auVar99 = vpmaxsd_avx(auVar99,(undefined1  [16])0x0);
        auVar99 = vblendvps_avx(auVar148,auVar99,auVar71);
        auVar87 = vpminsd_avx(auVar87,auVar148);
        auVar71 = vandps_avx(auVar71,auVar87);
        auVar99 = vpackusdw_avx(auVar99,auVar99);
        auVar71 = vpackusdw_avx(auVar71,auVar71);
        auVar71 = vpackuswb_avx(auVar99,auVar71);
        auVar71 = vpshufd_avx(auVar71,0xd8);
        *(long *)(local_1cf0 + (local_1a98 * 0x12 + 0xc) * 8) = auVar71._0_8_;
        *(float *)(local_1cf0 + (local_1a98 * 0x12 + 0xe) * 8) = auVar80._0_4_;
        *(int *)(local_1cf0 + lVar43 + 0x7c) = auVar70._0_4_;
        local_1a98 = local_1a98 + 1;
        pcVar51 = pcVar51 + 0x90;
      } while (local_1a98 != uVar52);
    }
    (local_1e80->ref).ptr = local_1aa0;
    *(undefined8 *)&(local_1e80->lbounds).bounds0.lower.field_0 = local_1e40._0_8_;
    *(undefined8 *)((long)&(local_1e80->lbounds).bounds0.lower.field_0 + 8) = local_1e40._8_8_;
    (local_1e80->lbounds).bounds0.upper.field_0 = aVar157;
    *(undefined8 *)&(local_1e80->lbounds).bounds1.lower.field_0 = local_1e30._0_8_;
    *(undefined8 *)((long)&(local_1e80->lbounds).bounds1.lower.field_0 + 8) = local_1e30._8_8_;
    (local_1e80->lbounds).bounds1.upper.field_0 = aVar149;
    local_1e80->dt = BStack_1898;
    return local_1e80;
  }
  lVar43 = 0xbc;
  do {
    *(undefined8 *)((long)&uStack_124c + lVar43) = 0xffffffff7f800000;
    *(undefined8 *)(&stack0xffffffffffffedbc + lVar43) = 0;
    lVar43 = lVar43 + 0xf0;
  } while (lVar43 != 0xfbc);
  local_2c0 = 1;
  local_b8 = 1;
  local_1240._0_8_ = uVar52;
  stack0xffffffffffffedd0 = local_1ee0;
  aVar149 = stack0xffffffffffffedd0;
  local_1220 = local_1eb0;
  local_1210 = local_1ec0;
  local_1200 = _local_1ef0;
  local_11f0 = local_18e0;
  local_11e0 = local_18d0;
  local_11d0._M_allocated_capacity._0_4_ = BVar44.lower;
  local_11d0._M_allocated_capacity._4_4_ = BVar44.upper;
  local_11d0._8_4_ = BVar36.lower;
  local_11d0._12_4_ = BVar36.upper;
  BStack_11c0 = local_1840;
  sStack_11b8 = sStack_1838;
  local_11b0._M_allocated_capacity._0_4_ = BStack_1830.lower;
  local_11b0._M_allocated_capacity._4_4_ = BStack_1830.upper;
  local_11b0._8_4_ = BStack_1828.lower;
  local_11b0._12_4_ = BStack_1828.upper;
  local_11a0[0] = BVar62;
  unique0x1000506b = uStack_1878;
  local_1190 = uVar67;
  unique0x1000506f = uStack_1874;
  local_1240._16_4_ = (undefined4)uVar76;
  local_1240._20_4_ = SUB84(uVar76,4);
  local_1180 = local_1240._16_4_;
  aiStack_117c[0] = local_1240._20_4_;
  local_2b8 = BVar62;
  local_2b0[0] = 2;
  local_340[0] = &local_2b8;
  local_1ec0._M_allocated_capacity = (size_type)&local_1c00;
  local_1ef0 = (undefined1  [8])&local_1b10;
  local_1e90 = (HeuristicMBlurTemporalSplit<embree::PrimRefMB,_embree::sse2::VirtualRecalculatePrimRef,_2UL>
                *)&this->heuristicTemporalSplit;
  local_1cc0._0_8_ = &BStack_1c30;
  local_1cd0._0_8_ = local_1bb0 + 0x70;
  local_1eb0.m128[2] = INFINITY;
  local_1eb0._0_8_ = 0x7f8000007f800000;
  local_1eb0.m128[3] = INFINITY;
  local_1ee0.m128[2] = -INFINITY;
  local_1ee0._0_8_ = 0xff800000ff800000;
  local_1ee0.m128[3] = -INFINITY;
  uVar52 = 0;
  unique0x1000a0b3 = aVar149;
  do {
    if (local_2c0 == 0) goto LAB_0138265a;
    lVar43 = -1;
    paVar49 = &local_11d0;
    uVar50 = 0;
    BVar53 = (BBox1f)0x0;
    do {
      uVar58 = (&paVar49->_M_allocated_capacity)[1] - paVar49->_M_allocated_capacity;
      if ((((this->cfg).maxLeafSize < uVar58) || (1 < *(uint *)((long)paVar49 + 0x4c))) ||
         ((uVar33 & 1) != 0)) {
        if (uVar50 < uVar58) {
          lVar43 = (long)BVar53;
          uVar50 = uVar58;
        }
        uVar33 = 0;
      }
      BVar53 = (BBox1f)((long)BVar53 + 1);
      paVar49 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(&paVar49->_M_allocated_capacity + 0x1e);
    } while ((BBox1f)local_2c0 != BVar53);
    if (lVar43 == -1) goto LAB_01382610;
    lVar34 = lVar43 * 0xf0;
    local_1f20 = (BBox1f *)(local_1240 + lVar43 * 0xf0);
    local_1cb0._0_8_ = local_1930 + 1;
    local_1c00 = 0xffffffff7f800000;
    uStack_1bf8 = 0;
    local_1bc0._0_8_ = local_1930 + 1;
    local_1b10 = 0xffffffff7f800000;
    uStack_1b08 = 0;
    iVar7 = aiStack_117c[(lVar43 * 0x1e + -1) * 2];
    local_1ea0 = (uint)uVar52;
    uStack_1e9c = (undefined4)(uVar52 >> 0x20);
    local_1e30._0_4_ = uVar33;
    local_1e40._0_8_ = local_1190 + lVar34;
    if (iVar7 == 0) {
      BVar53 = (BBox1f)(&local_11d0)[lVar43 * 0xf]._M_allocated_capacity;
      BVar44 = (&BStack_11c0)[lVar43 * 0x1e + -1];
      local_1e20._0_4_ = INFINITY;
      local_1e20._4_4_ = INFINITY;
      local_1e20._8_4_ = INFINITY;
      local_1e20._12_4_ = INFINITY;
      aStack_1e10.m128[0] = -INFINITY;
      aStack_1e10.m128[1] = -INFINITY;
      aStack_1e10.m128[2] = -INFINITY;
      aStack_1e10.m128[3] = -INFINITY;
      local_1e00.m128[0] = INFINITY;
      local_1e00.m128[1] = INFINITY;
      local_1e00.m128[2] = INFINITY;
      local_1e00.m128[3] = INFINITY;
      aStack_1df0.m128[0] = -INFINITY;
      aStack_1df0.m128[1] = -INFINITY;
      aStack_1df0.m128[2] = -INFINITY;
      aStack_1df0.m128[3] = -INFINITY;
      local_1de0.m128[0] = INFINITY;
      local_1de0.m128[1] = INFINITY;
      local_1de0.m128[2] = INFINITY;
      local_1de0.m128[3] = INFINITY;
      aStack_1dd0.m128[0] = -INFINITY;
      aStack_1dd0.m128[1] = -INFINITY;
      aStack_1dd0.m128[2] = -INFINITY;
      aStack_1dd0.m128[3] = -INFINITY;
      local_1da0 = 0.0;
      local_1dc0.lower = 0.0;
      local_1dc0.upper = 0.0;
      BStack_1db8.lower = 0.0;
      BStack_1db8.upper = 0.0;
      sStack_1db0 = 0;
      sStack_1da8 = 0;
      auVar92._8_4_ = 0x3f800000;
      auVar92._0_8_ = 0x3f8000003f800000;
      auVar92._12_4_ = 0x3f800000;
      uVar67 = vmovlps_avx(auVar92);
      fStack_1d9c = (float)uVar67;
      fStack_1d98 = (float)((ulong)uVar67 >> 0x20);
      fStack_1d94 = 0.0;
      local_1d90._0_8_ = (BBox1f *)0x7f8000007f800000;
      local_1d90.m128[2] = INFINITY;
      local_1d90.m128[3] = INFINITY;
      uStack_1d80 = 0xff800000ff800000;
      uStack_1d78 = 0xff800000;
      uStack_1d74 = 0xff800000;
      local_1d70 = 0x7f800000;
      uStack_1d6c = 0x7f800000;
      uStack_1d68 = 0x7f800000;
      uStack_1d64 = 0x7f800000;
      uStack_1d60 = 0xff800000;
      uStack_1d5c = 0xff800000;
      uStack_1d58 = 0xff800000;
      uStack_1d54 = 0xff800000;
      local_1d50 = 0x7f800000;
      uStack_1d4c = 0x7f800000;
      uStack_1d48 = 0x7f800000;
      uStack_1d44 = 0x7f800000;
      uStack_1d40 = 0xff800000;
      uStack_1d3c = 0xff800000;
      uStack_1d38 = 0xff800000;
      uStack_1d34 = 0xff800000;
      local_1d10 = 0;
      local_1d30.lower = 0.0;
      local_1d30.upper = 0.0;
      BStack_1d28.lower = 0.0;
      BStack_1d28.upper = 0.0;
      uStack_1d20 = 0;
      uStack_1d18 = 0;
      uVar67 = vmovlps_avx(auVar92);
      uStack_1d0c = (undefined4)uVar67;
      uStack_1d08 = (undefined4)((ulong)uVar67 >> 0x20);
      uStack_1d04 = 0;
      local_19b0._4_4_ = *(undefined4 *)(local_1190 + lVar34 + 8);
      local_19b0._0_4_ = local_19b0._4_4_;
      uStack_19a8._4_4_ = (float)local_19b0._4_4_;
      uStack_19a8._0_4_ = (__atomic_base<unsigned_int>)(__atomic_base<unsigned_int>)local_19b0._4_4_
      ;
      lVar35 = (long)(1 << (local_1190[lVar34 + 4] & 0x1f)) * 0x10;
      local_1ad0.prims = (mvector<embree::PrimRefMB> *)*(BBox1f *)(mm_lookupmask_ps + lVar35);
      local_1ad0.time_range0 = *(BBox1f **)(mm_lookupmask_ps + lVar35 + 8);
      local_1a40._0_8_ = local_1190 + lVar34;
      local_1a40._8_8_ = local_19b0;
      local_1a30._0_8_ = &local_1ad0;
      BStack_1c38 = (BBox1f)parallel_partitioning<embree::PrimRefMB,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::EmptyTy,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_>
                                      (*(PrimRefMB **)((long)local_11a0[lVar43 * 0x1e] + 0x20),
                                       (size_t)BVar53,(size_t)BVar44,(EmptyTy *)local_1a50,
                                       (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_1e20,
                                       (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)
                                       &local_1d90.field_1,
                                       (anon_class_24_3_c5d13451 *)(local_1a50 + 0x10),
                                       (anon_class_1_0_00000001 *)&local_1ce8,
                                       (anon_class_1_0_00000001 *)&local_1a68,0x80,0xc00);
      auVar99 = stack0xffffffffffffe4d0;
      local_1c10 = local_11a0[lVar43 * 0x1e];
      auVar68._8_8_ = 0;
      auVar68._0_4_ = local_11a0[lVar43 * 0x1e + -1].lower;
      auVar68._4_4_ = local_11a0[lVar43 * 0x1e + -1].upper;
      local_1ca0._12_4_ = local_1e20._12_4_;
      local_1ca0._8_4_ = local_1e20._8_4_;
      aStack_1c90.m128[1] = aStack_1e10.m128[1];
      aStack_1c90.m128[0] = aStack_1e10.m128[0];
      aStack_1c90.m128[3] = aStack_1e10.m128[3];
      aStack_1c90.m128[2] = aStack_1e10.m128[2];
      local_1c80._0_8_ = CONCAT44(local_1e00.m128[1],local_1e00.m128[0]);
      local_1c80.m128[3] = local_1e00.m128[3];
      local_1c80.m128[2] = local_1e00.m128[2];
      aStack_1c70.m128[1] = aStack_1df0.m128[1];
      aStack_1c70.m128[0] = aStack_1df0.m128[0];
      aStack_1c70.m128[3] = aStack_1df0.m128[3];
      aStack_1c70.m128[2] = aStack_1df0.m128[2];
      local_1c60.upper = local_1de0.m128[1];
      local_1c60.lower = local_1de0.m128[0];
      BStack_1c58.upper = local_1de0.m128[3];
      BStack_1c58.lower = local_1de0.m128[2];
      BStack_1c50.upper = aStack_1dd0.m128[1];
      BStack_1c50.lower = aStack_1dd0.m128[0];
      BStack_1c48.upper = aStack_1dd0.m128[3];
      BStack_1c48.lower = aStack_1dd0.m128[2];
      local_1ca0._0_8_ = local_1e20._0_8_;
      *(size_t *)local_1cc0._0_8_ = sStack_1db0;
      *(size_t *)(local_1cc0._0_8_ + 8) = sStack_1da8;
      *(size_t *)(local_1cc0._0_8_ + 0x10) = CONCAT44(fStack_1d9c,local_1da0);
      *(size_t *)(local_1cc0._0_8_ + 0x18) = CONCAT44(fStack_1d94,fStack_1d98);
      auVar78._8_8_ = 0;
      auVar78._0_8_ = auStack_1c20._8_8_;
      auVar69 = vcmpps_avx(auVar78,auVar68,1);
      auVar71 = vinsertps_avx(auVar68,auVar78,0x50);
      auVar70 = vinsertps_avx(auVar78,auVar68,0x50);
      auVar69 = vblendvps_avx(auVar70,auVar71,auVar69);
      uVar67 = vmovlps_avx(auVar69);
      auStack_1c20._8_8_ = uVar67;
      local_1bb0._0_8_ = local_1d90._0_8_;
      local_1bb0._8_8_ = local_1d90._8_8_;
      local_1bb0._24_8_ = CONCAT44(uStack_1d74,uStack_1d78);
      local_1bb0._16_8_ = uStack_1d80;
      local_1bb0._32_8_ = CONCAT44(uStack_1d6c,local_1d70);
      local_1bb0._40_8_ = CONCAT44(uStack_1d64,uStack_1d68);
      local_1bb0._48_8_ = CONCAT44(uStack_1d5c,uStack_1d60);
      local_1bb0._56_8_ = CONCAT44(uStack_1d54,uStack_1d58);
      local_1bb0._64_8_ = CONCAT44(uStack_1d4c,local_1d50);
      local_1bb0._72_8_ = CONCAT44(uStack_1d44,uStack_1d48);
      local_1bb0._80_8_ = CONCAT44(uStack_1d3c,uStack_1d40);
      local_1bb0._88_8_ = CONCAT44(uStack_1d34,uStack_1d38);
      *(undefined8 *)local_1cd0._0_8_ = uStack_1d20;
      *(undefined8 *)(local_1cd0._0_8_ + 8) = uStack_1d18;
      *(ulong *)(local_1cd0._0_8_ + 0x10) = CONCAT44(uStack_1d0c,local_1d10);
      *(ulong *)(local_1cd0._0_8_ + 0x18) = CONCAT44(uStack_1d04,uStack_1d08);
      auVar79._8_8_ = 0;
      auVar79._0_4_ = BStack_1b28.lower;
      auVar79._4_4_ = BStack_1b28.upper;
      auVar69 = vcmpps_avx(auVar79,auVar68,1);
      auVar71 = vinsertps_avx(auVar68,auVar79,0x50);
      auVar70 = vinsertps_avx(auVar79,auVar68,0x50);
      auVar69 = vblendvps_avx(auVar70,auVar71,auVar69);
      BStack_1b28 = (BBox1f)vmovlps_avx(auVar69);
      local_1bb0._128_8_ = auVar99._0_8_;
      local_1c40 = BVar53;
      local_1bb0._96_8_ = BStack_1c38;
      local_1bb0._104_8_ = BVar44;
      local_1b20 = local_1c10;
LAB_0138189e:
      local_1f28.lower = 0.0;
      local_1f28.upper = 0.0;
      bVar65 = false;
    }
    else {
      local_1f00 = (SetMB *)(local_1240 + lVar34 + 0x10);
      if (iVar7 != 2) {
        if (iVar7 == 1) {
          SetMB::deterministic_order(local_1f00);
          splitFallback(this,local_1f00,
                        (SetMB *)&((anon_union_16_2_47237d3f_for_Vec3fa_0 *)local_1ca0)->field_1,
                        (SetMB *)local_1bb0);
        }
        else if (iVar7 == 3) {
          SetMB::deterministic_order(local_1f00);
          splitByGeometry(this,local_1f00,
                          (SetMB *)&((anon_union_16_2_47237d3f_for_Vec3fa_0 *)local_1ca0)->field_1,
                          (SetMB *)local_1bb0);
        }
        goto LAB_0138189e;
      }
      local_1e70.lower = *(float *)(local_1190 + lVar34 + 8);
      local_1e68.lower = local_11a0[lVar43 * 0x1e + -1].lower;
      local_1e70.upper = local_11a0[lVar43 * 0x1e + -1].upper;
      local_1ec8 = local_11a0[lVar43 * 0x1e];
      local_1e68.upper = local_1e70.lower;
      BVar36 = (BBox1f)operator_new(0x28);
      pMVar8 = local_1e90->device;
      BVar53 = (&BStack_11c0)[lVar43 * 0x1e + -1];
      *(MemoryMonitorInterface **)BVar36 = pMVar8;
      *(undefined1 *)((long)BVar36 + 8) = 0;
      *(long *)((long)BVar36 + 0x10) = 0;
      *(long *)((long)BVar36 + 0x18) = 0;
      *(long *)((long)BVar36 + 0x20) = 0;
      lVar34 = (long)BVar53 - (&local_11d0)[lVar43 * 0xf]._M_allocated_capacity;
      BVar44 = BVar53;
      if (lVar34 != 0) {
        uVar52 = lVar34 * 0x50;
        (**pMVar8->_vptr_MemoryMonitorInterface)(pMVar8,uVar52,0);
        if (uVar52 < 0x1c00000) {
          pvVar37 = alignedMalloc(uVar52,0x10);
        }
        else {
          pvVar37 = os_malloc(uVar52,(bool *)((long)BVar36 + 8));
        }
        *(void **)((long)BVar36 + 0x20) = pvVar37;
        *(long *)((long)BVar36 + 0x10) = lVar34;
        *(long *)((long)BVar36 + 0x18) = lVar34;
        BVar44 = local_1f20[0xe];
        BVar53 = local_1f20[0xf];
      }
      uVar76 = local_1a40._8_8_;
      BVar62 = local_1ec8;
      local_1ad0.prims = (mvector<embree::PrimRefMB> *)local_1ec8;
      local_1ad0.time_range0 = &local_1e68;
      local_1ad0.this = local_1e90;
      local_1ad0.lprims = (PrimRefVector *)local_1e50;
      local_1ad0.set = local_1f00;
      local_1d90._0_8_ = (BBox1f *)0x7f8000007f800000;
      local_1d90.m128[2] = INFINITY;
      local_1d90.m128[3] = INFINITY;
      uStack_1d80 = 0xff800000ff800000;
      uStack_1d78 = 0xff800000;
      uStack_1d74 = 0xff800000;
      local_1d70 = 0x7f800000;
      uStack_1d6c = 0x7f800000;
      uStack_1d68 = 0x7f800000;
      uStack_1d64 = 0x7f800000;
      uStack_1d60 = 0xff800000;
      uStack_1d5c = 0xff800000;
      uStack_1d58 = 0xff800000;
      uStack_1d54 = 0xff800000;
      local_1d50 = 0x7f800000;
      uStack_1d4c = 0x7f800000;
      uStack_1d48 = 0x7f800000;
      uStack_1d44 = 0x7f800000;
      uStack_1d40 = 0xff800000;
      uStack_1d3c = 0xff800000;
      uStack_1d38 = 0xff800000;
      uStack_1d34 = 0xff800000;
      local_1d10 = 0;
      local_1d30.lower = 0.0;
      local_1d30.upper = 0.0;
      BStack_1d28.lower = 0.0;
      BStack_1d28.upper = 0.0;
      uStack_1d20 = 0;
      uStack_1d18 = 0;
      auVar69._8_4_ = 0x3f800000;
      auVar69._0_8_ = 0x3f8000003f800000;
      auVar69._12_4_ = 0x3f800000;
      uVar67 = vmovlps_avx(auVar69);
      uStack_1d0c = (undefined4)uVar67;
      uStack_1d08 = (undefined4)((ulong)uVar67 >> 0x20);
      uStack_1d04 = 0;
      local_1f28 = BVar36;
      local_1e50[0] = BVar36;
      if ((ulong)((long)BVar53 - (long)BVar44) < 0xc00) {
        local_1a40._0_8_ = BVar44;
        local_1a40._8_8_ = BVar53;
        ::anon_func::anon_class_40_5_808acc65::operator()
                  ((PrimInfoMB *)local_1e20,&local_1ad0,(range<unsigned_long> *)(local_1a50 + 0x10))
        ;
      }
      else {
        local_1a40._12_1_ = 1;
        local_1a20._0_8_ = 0;
        local_1a20._8_8_ = 0;
        local_1a00._0_8_ = 8;
        local_1a40._14_2_ = SUB82(uVar76,6);
        local_1a40._13_1_ = 4;
        tbb::detail::r1::initialize((task_group_context *)(local_1a50 + 0x10));
        local_19a0 = (anon_union_8_2_d71db6ad_for_task_group_context_11)0x80;
        local_1ce8._0_8_ = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
        local_1ce8._8_8_ = &local_1ad0;
        local_19b0 = (undefined1  [8])BVar53;
        uStack_19a8 = BVar44;
        tbb::detail::d1::
        parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::GridRecalculatePrimRef,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::GridRecalculatePrimRef,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                  ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_1e20,(d1 *)local_19b0,
                   (blocked_range<unsigned_long> *)&local_1d90.field_1,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_1ce8,
                   (anon_class_16_2_ed117de8_conflict20 *)
                   PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                   (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                    *)(local_1a50 + 0x10),in_stack_ffffffffffffe0c0);
        cVar32 = tbb::detail::r1::is_group_execution_cancelled
                           ((task_group_context *)(local_1a50 + 0x10));
        if (cVar32 != '\0') {
          prVar41 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar41,"task cancelled");
          __cxa_throw(prVar41,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        tbb::detail::r1::destroy((task_group_context *)(local_1a50 + 0x10));
        BVar62 = local_1ec8;
      }
      BVar53 = local_1f20[0xe];
      BVar44 = local_1f20[0xf];
      uVar52 = (long)BVar44 - (long)BVar53;
      if ((long)BStack_1db8 - (long)local_1dc0 != uVar52) {
        local_1d90._0_8_ = &local_1e68;
        BStack_1db8 = (BBox1f)parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::GridRecalculatePrimRef,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_>
                                        (*(PrimRefMB **)((long)local_1e50[0] + 0x20),0,uVar52,0x400,
                                         (anon_class_8_1_41ce32a5 *)&local_1d90.field_1);
        BVar53 = local_1f20[0xe];
        BVar44 = local_1f20[0xf];
        uVar52 = (long)BVar44 - (long)BVar53;
      }
      BVar36 = uStack_19a8;
      auVar70._4_4_ = local_1e68.upper;
      auVar70._0_4_ = local_1e68.lower;
      auVar70._8_8_ = 0;
      local_1ca0._12_4_ = local_1e20._12_4_;
      local_1ca0._8_4_ = local_1e20._8_4_;
      aStack_1c90.m128[1] = aStack_1e10.m128[1];
      aStack_1c90.m128[0] = aStack_1e10.m128[0];
      aStack_1c90.m128[3] = aStack_1e10.m128[3];
      aStack_1c90.m128[2] = aStack_1e10.m128[2];
      local_1c80._0_8_ = CONCAT44(local_1e00.m128[1],local_1e00.m128[0]);
      local_1c80.m128[3] = local_1e00.m128[3];
      local_1c80.m128[2] = local_1e00.m128[2];
      aStack_1c70.m128[1] = aStack_1df0.m128[1];
      aStack_1c70.m128[0] = aStack_1df0.m128[0];
      aStack_1c70.m128[3] = aStack_1df0.m128[3];
      aStack_1c70.m128[2] = aStack_1df0.m128[2];
      local_1c60.upper = local_1de0.m128[1];
      local_1c60.lower = local_1de0.m128[0];
      BStack_1c58.upper = local_1de0.m128[3];
      BStack_1c58.lower = local_1de0.m128[2];
      BStack_1c50.upper = aStack_1dd0.m128[1];
      BStack_1c50.lower = aStack_1dd0.m128[0];
      BStack_1c48.upper = aStack_1dd0.m128[3];
      BStack_1c48.lower = aStack_1dd0.m128[2];
      *(size_t *)local_1cc0._0_8_ = sStack_1db0;
      *(size_t *)(local_1cc0._0_8_ + 8) = sStack_1da8;
      local_1ca0._0_8_ = local_1e20._0_8_;
      local_1c40 = local_1dc0;
      auVar80._4_4_ = fStack_1d9c;
      auVar80._0_4_ = local_1da0;
      auVar80._8_8_ = 0;
      auVar87._4_4_ = fStack_1d94;
      auVar87._0_4_ = fStack_1d98;
      auVar87._8_8_ = 0;
      auVar69 = vcmpps_avx(auVar87,auVar70,1);
      auVar71 = vinsertps_avx(auVar70,auVar87,0x50);
      auVar70 = vinsertps_avx(auVar87,auVar70,0x50);
      auVar69 = vblendvps_avx(auVar70,auVar71,auVar69);
      auStack_1c20 = vmovlhps_avx(auVar80,auVar69);
      local_1c10 = local_1e50[0];
      local_1a68.time_range1 = &local_1e70;
      local_1a68.this = local_1e90;
      local_1a40.m128[0] = INFINITY;
      local_1a40.m128[1] = INFINITY;
      local_1a40._8_8_ = (undefined1 *)0x7f8000007f800000;
      local_1a30._0_8_ = (anon_class_40_5_808acc65 *)0xff800000ff800000;
      local_1a30.m128[2] = -INFINITY;
      local_1a30.m128[3] = -INFINITY;
      local_1a20._0_8_ = 0x7f8000007f800000;
      local_1a20._8_8_ = 0x7f8000007f800000;
      local_1a10.m128[0] = -INFINITY;
      local_1a10.m128[1] = -INFINITY;
      local_1a10.m128[2] = -INFINITY;
      local_1a10.m128[3] = -INFINITY;
      local_1a00._0_8_ = 0x7f8000007f800000;
      local_1a00.m128[2] = INFINITY;
      local_1a00.m128[3] = INFINITY;
      local_19f0 = 0xff800000;
      uStack_19ec = 0xff800000;
      uStack_19e8 = 0xff800000;
      uStack_19e4 = 0xff800000;
      local_19c0 = 0;
      local_19e0 = 0;
      sStack_19d8 = 0;
      BStack_19d0.lower = 0.0;
      BStack_19d0.upper = 0.0;
      BStack_19c8.lower = 0.0;
      BStack_19c8.upper = 0.0;
      auVar71._8_4_ = 0x3f800000;
      auVar71._0_8_ = 0x3f8000003f800000;
      auVar71._12_4_ = 0x3f800000;
      local_19bc = vmovlps_avx(auVar71);
      local_19b4 = 0;
      BStack_1c38 = BStack_1db8;
      local_1a68.prims = (mvector<embree::PrimRefMB> *)BVar62;
      if (uVar52 < 0xc00) {
        local_19b0 = (undefined1  [8])BVar53;
        uStack_19a8 = BVar44;
        ::anon_func::anon_class_24_3_35f68c7c::operator()
                  ((PrimInfoMB *)&local_1d90.field_1,&local_1a68,(range<unsigned_long> *)local_19b0)
        ;
      }
      else {
        uStack_19a8._4_1_ = proxy_support;
        local_1990 = (intrusive_list_node *)0x0;
        piStack_1988 = (intrusive_list_node *)0x0;
        local_1970 = CUSTOM_CTX;
        uStack_19a8._6_2_ = BVar36.upper._2_2_;
        uStack_19a8._5_1_ = (context_traits)0x4;
        tbb::detail::r1::initialize((task_group_context *)local_19b0);
        local_1cd8 = (undefined1  [8])0x80;
        local_1a50._0_8_ = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
        local_1a50._8_8_ = &local_1a68;
        local_1ce8._0_8_ = BVar44;
        local_1ce8._8_8_ = BVar53;
        tbb::detail::d1::
        parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::GridRecalculatePrimRef,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::GridRecalculatePrimRef,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                  ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_1d90.field_1,
                   (d1 *)&local_1ce8,(blocked_range<unsigned_long> *)(local_1a50 + 0x10),
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_1a50,
                   (anon_class_16_2_ed117de8_conflict21 *)
                   PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                   (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                    *)local_19b0,in_stack_ffffffffffffe0c0);
        cVar32 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)local_19b0);
        if (cVar32 != '\0') {
          prVar41 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar41,"task cancelled");
          __cxa_throw(prVar41,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        tbb::detail::r1::destroy((task_group_context *)local_19b0);
        BVar62 = local_1ec8;
      }
      lVar34 = (long)BStack_1d28 - (long)local_1d30;
      local_1d30 = local_1f20[0xe];
      BStack_1d28 = (BBox1f)(lVar34 + (long)local_1d30);
      if (lVar34 != (long)local_1f20[0xf] - (long)local_1d30) {
        local_1a40._0_8_ = &local_1e70;
        BStack_1d28 = (BBox1f)parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::GridRecalculatePrimRef,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_2_>
                                        (*(PrimRefMB **)((long)BVar62 + 0x20),
                                         (unsigned_long)local_1d30,(unsigned_long)local_1f20[0xf],
                                         0x400,(anon_class_8_1_41ce32a6 *)(local_1a50 + 0x10));
      }
      auVar72._4_4_ = local_1e70.upper;
      auVar72._0_4_ = local_1e70.lower;
      auVar72._8_8_ = 0;
      local_1bb0._0_8_ = local_1d90._0_8_;
      local_1bb0._8_4_ = local_1d90.m128[2];
      local_1bb0._12_4_ = local_1d90.m128[3];
      local_1bb0._16_8_ = uStack_1d80;
      local_1bb0._24_8_ = CONCAT44(uStack_1d74,uStack_1d78);
      local_1bb0._32_8_ = CONCAT44(uStack_1d6c,local_1d70);
      local_1bb0._40_8_ = CONCAT44(uStack_1d64,uStack_1d68);
      local_1bb0._48_8_ = CONCAT44(uStack_1d5c,uStack_1d60);
      local_1bb0._56_8_ = CONCAT44(uStack_1d54,uStack_1d58);
      local_1bb0._64_8_ = CONCAT44(uStack_1d4c,local_1d50);
      local_1bb0._72_8_ = CONCAT44(uStack_1d44,uStack_1d48);
      local_1bb0._80_8_ = CONCAT44(uStack_1d3c,uStack_1d40);
      local_1bb0._88_8_ = CONCAT44(uStack_1d34,uStack_1d38);
      *(undefined8 *)local_1cd0._0_8_ = uStack_1d20;
      *(undefined8 *)(local_1cd0._0_8_ + 8) = uStack_1d18;
      auVar81._4_4_ = uStack_1d0c;
      auVar81._0_4_ = local_1d10;
      auVar81._8_8_ = 0;
      auVar88._4_4_ = uStack_1d04;
      auVar88._0_4_ = uStack_1d08;
      auVar88._8_8_ = 0;
      auVar69 = vcmpps_avx(auVar88,auVar72,1);
      auVar71 = vinsertps_avx(auVar72,auVar88,0x50);
      auVar70 = vinsertps_avx(auVar88,auVar72,0x50);
      auVar69 = vblendvps_avx(auVar70,auVar71,auVar69);
      unique0x000f4700 = vmovlhps_avx(auVar81,auVar69);
      bVar65 = local_1f28 != (BBox1f)0x0;
      local_1bb0._96_8_ = local_1d30;
      local_1bb0._104_8_ = BStack_1d28;
      local_1b20 = BVar62;
    }
    BVar53 = (BBox1f)local_1e20;
    findFallback((Split *)BVar53,this,
                 (SetMB *)&((anon_union_16_2_47237d3f_for_Vec3fa_0 *)local_1ca0)->field_1);
    BVar44.upper = (float)local_1e20._12_4_;
    BVar44.lower = (float)local_1e20._8_4_;
    *(undefined8 *)local_1ec0._0_8_ = local_1e20._0_8_;
    *(BBox1f *)(local_1ec0._0_8_ + 8) = BVar44;
    local_1bf0.upper = aStack_1e10.m128[1];
    local_1bf0.lower = aStack_1e10.m128[0];
    local_1be0.upper = local_1e00.m128[1];
    local_1be0.lower = local_1e00.m128[0];
    BStack_1bd8.upper = local_1e00.m128[3];
    BStack_1bd8.lower = local_1e00.m128[2];
    BStack_1bd0.upper = aStack_1df0.m128[1];
    BStack_1bd0.lower = aStack_1df0.m128[0];
    BStack_1bc8.upper = aStack_1df0.m128[3];
    BStack_1bc8.lower = aStack_1df0.m128[2];
    findFallback((Split *)BVar53,this,(SetMB *)local_1bb0);
    lVar34 = local_b8;
    BVar36.upper = (float)local_1e20._12_4_;
    BVar36.lower = (float)local_1e20._8_4_;
    *(undefined8 *)local_1ef0 = local_1e20._0_8_;
    *(BBox1f *)((long)local_1ef0 + 8) = BVar36;
    local_1b00 = CONCAT44(aStack_1e10.m128[1],aStack_1e10.m128[0]);
    local_1af0 = CONCAT44(local_1e00.m128[1],local_1e00.m128[0]);
    uStack_1ae8 = CONCAT44(local_1e00.m128[3],local_1e00.m128[2]);
    sStack_1ae0 = CONCAT44(aStack_1df0.m128[1],aStack_1df0.m128[0]);
    uStack_1ad8 = CONCAT44(aStack_1df0.m128[3],aStack_1df0.m128[2]);
    local_1f28 = (BBox1f)0x0;
    pBVar48 = local_340[lVar43];
    if (local_1c10 == *pBVar48) {
      pBVar48[1] = (BBox1f)((long)pBVar48[1] + 1);
      BVar44 = local_1c10;
    }
    else {
      local_b8 = local_b8 + 1;
      BVar53 = (BBox1f)&local_2b8;
      *(BBox1f *)
       ((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
         *)((long)BVar53 + 0x78) + (lVar34 * 2 + -0xf) * 8) = local_1c10;
      local_2b0[lVar34 * 2] = 1;
      local_340[lVar43] =
           (BBox1f *)
           ((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
             *)((long)BVar53 + 0x78) + (lVar34 * 2 + -0xf) * 8);
      BVar44 = *pBVar48;
    }
    lVar43 = local_b8;
    if (local_1b20 == BVar44) {
      local_340[local_2c0] = pBVar48;
      BVar44 = pBVar48[1];
      pBVar48[1] = (BBox1f)((long)BVar44 + 1);
    }
    else {
      local_b8 = local_b8 + 1;
      BVar53 = (BBox1f)&local_2b8;
      *(BBox1f *)
       ((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
         *)((long)BVar53 + 0x78) + (lVar43 * 2 + -0xf) * 8) = local_1b20;
      local_2b0[lVar43 * 2] = 1;
      local_340[local_2c0] =
           (BBox1f *)
           ((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
             *)((long)BVar53 + 0x78) + (lVar43 * 2 + -0xf) * 8);
      BVar44 = (BBox1f)((long)pBVar48[1] + -1);
    }
    pBVar48[1] = BVar44;
    if (BVar44 == (BBox1f)0x0) {
      BVar53 = *pBVar48;
      if (BVar53 != (BBox1f)0x0) {
        lVar43 = *(long *)((long)BVar53 + 0x18);
        pvVar37 = *(void **)&((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
                               *)((long)BVar53 + 0x20))->field_0x0;
        if (pvVar37 != (void *)0x0) {
          if ((ulong)(lVar43 * 0x50) < 0x1c00000) {
            alignedFree(pvVar37);
          }
          else {
            os_free(pvVar37,lVar43 * 0x50,
                    (bool)*(default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
                            *)((long)BVar53 + 8));
          }
        }
        if (lVar43 != 0) {
          (**(code **)**(undefined8 **)BVar53)(*(undefined8 **)BVar53,lVar43 * -0x50,1);
        }
        *(undefined8 *)
         &((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
            *)((long)BVar53 + 0x10))->field_0x0 = 0;
        *(undefined8 *)((long)BVar53 + 0x18) = 0;
        *(undefined8 *)
         &((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
            *)((long)BVar53 + 0x20))->field_0x0 = 0;
      }
      operator_delete((void *)BVar53);
    }
    uVar52 = local_2c0;
    auVar71 = stack0xffffffffffffe4d0;
    auVar69 = auStack_1c20;
    local_1f20->lower = (float)local_1cb0._0_4_;
    local_1f20->upper = (float)local_1cb0._4_4_;
    local_1f20[2].lower = (float)local_1ca0._0_4_;
    local_1f20[2].upper = (float)local_1ca0._4_4_;
    local_1f20[3].lower = (float)local_1ca0._8_4_;
    local_1f20[3].upper = (float)local_1ca0._12_4_;
    local_1f20[4].lower = (float)aStack_1c90._0_4_;
    local_1f20[4].upper = aStack_1c90.m128[1];
    local_1f20[5].lower = (float)aStack_1c90._8_4_;
    local_1f20[5].upper = aStack_1c90.m128[3];
    local_1f20[6].lower = (float)local_1c80._0_4_;
    local_1f20[6].upper = local_1c80.m128[1];
    local_1f20[7].lower = (float)local_1c80._8_4_;
    local_1f20[7].upper = local_1c80.m128[3];
    local_1f20[8].lower = (float)aStack_1c70._0_4_;
    local_1f20[8].upper = aStack_1c70.m128[1];
    local_1f20[9].lower = (float)aStack_1c70._8_4_;
    local_1f20[9].upper = aStack_1c70.m128[3];
    local_1f20[10] = local_1c60;
    local_1f20[0xb] = BStack_1c58;
    local_1f20[0xc] = BStack_1c50;
    local_1f20[0xd] = BStack_1c48;
    local_1f20[0xe] = local_1c40;
    local_1f20[0xf] = BStack_1c38;
    local_1f20[0x10] = BStack_1c30;
    local_1f20[0x11] = BStack_1c28;
    local_1f20[0x12].lower = (float)auStack_1c20._0_4_;
    local_1f20[0x12].upper = (float)auStack_1c20._4_4_;
    local_1f20[0x13].lower = (float)auStack_1c20._8_4_;
    local_1f20[0x13].upper = (float)auStack_1c20._12_4_;
    local_1f20[0x14] = local_1c10;
    uVar67 = *(undefined8 *)(local_1ec0._0_8_ + 8);
    *(undefined8 *)local_1e40._0_8_ = *(undefined8 *)local_1ec0._0_8_;
    *(undefined8 *)(local_1e40._0_8_ + 8) = uVar67;
    local_1f20[0x18] = local_1bf0;
    local_1f20[0x1a] = local_1be0;
    local_1f20[0x1b] = BStack_1bd8;
    local_1f20[0x1c] = BStack_1bd0;
    local_1f20[0x1d] = BStack_1bc8;
    lVar34 = local_2c0 * 0xf0;
    lVar43 = local_2c0 * 0xf0;
    ((BBox1f *)(local_1240 + lVar43))->lower = (float)local_1bc0._0_4_;
    ((BBox1f *)(local_1240 + lVar43))->upper = (float)local_1bc0._4_4_;
    *(undefined8 *)(local_1240 + lVar34 + 0x10) = local_1bb0._0_8_;
    (&BStack_1228)[uVar52 * 0x1e].lower = (float)local_1bb0._8_4_;
    (&BStack_1228)[uVar52 * 0x1e].upper = (float)local_1bb0._12_4_;
    *(undefined8 *)(&local_1220 + uVar52 * 0xf) = local_1bb0._16_8_;
    *(undefined8 *)((long)&local_1220 + lVar34 + 8) = local_1bb0._24_8_;
    *(undefined8 *)(local_1210._M_local_buf + lVar34) = local_1bb0._32_8_;
    *(undefined8 *)(local_1210._M_local_buf + lVar34 + 8) = local_1bb0._40_8_;
    *(undefined8 *)(&local_1200 + uVar52 * 0xf) = local_1bb0._48_8_;
    *(undefined8 *)((long)&local_1200 + lVar34 + 8) = local_1bb0._56_8_;
    *(undefined8 *)(local_11f0._M_local_buf + lVar34) = local_1bb0._64_8_;
    *(undefined8 *)(local_11f0._M_local_buf + lVar34 + 8) = local_1bb0._72_8_;
    *(undefined8 *)(&local_11e0 + uVar52 * 0xf) = local_1bb0._80_8_;
    *(undefined8 *)((long)&local_11e0 + lVar34 + 8) = local_1bb0._88_8_;
    (&local_11d0)[uVar52 * 0xf]._M_allocated_capacity = local_1bb0._96_8_;
    (&BStack_11c0)[uVar52 * 0x1e + -1].lower = (float)local_1bb0._104_4_;
    (&BStack_11c0)[uVar52 * 0x1e + -1].upper = (float)local_1bb0._108_4_;
    (&BStack_11c0)[uVar52 * 0x1e].lower = (float)local_1bb0._112_4_;
    (&BStack_11c0)[uVar52 * 0x1e].upper = (float)local_1bb0._116_4_;
    (&BStack_11c0)[uVar52 * 0x1e + 1].lower = (float)local_1bb0._120_4_;
    (&BStack_11c0)[uVar52 * 0x1e + 1].upper = (float)local_1bb0._124_4_;
    ((BBox1f *)(&local_11b0._M_allocated_capacity + uVar52 * 0x1e))->lower =
         (float)local_1bb0._128_4_;
    ((BBox1f *)(&local_11b0._M_allocated_capacity + uVar52 * 0x1e))->upper =
         (float)local_1bb0._132_4_;
    local_11a0[uVar52 * 0x1e + -1] = BStack_1b28;
    local_11a0[uVar52 * 0x1e] = local_1b20;
    uVar67 = *(undefined8 *)((long)local_1ef0 + 8);
    *(undefined8 *)(local_1190 + lVar34) = *(undefined8 *)local_1ef0;
    *(undefined8 *)(local_1190 + lVar34 + 8) = uVar67;
    *(undefined8 *)((long)&stack0xffffffffffffee80 + uVar52 * 0xf0) = local_1b00;
    (&local_1170._M_allocated_capacity)[uVar52 * 0x1e] = local_1af0;
    *(undefined8 *)((long)local_1160 + (uVar52 * 0xf + -1) * 0x10 + 8) = uStack_1ae8;
    local_1160[uVar52 * 0xf]._M_allocated_capacity = sStack_1ae0;
    *(undefined8 *)((long)local_1160 + uVar52 * 0xf0 + 8) = uStack_1ad8;
    local_2c0 = local_2c0 + 1;
    auStack_1c20 = auVar69;
    unique0x1000a013 = auVar71;
    if (local_1f28 != (BBox1f)0x0) {
      BVar53 = (BBox1f)&local_1f28;
      std::
      default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
      ::operator()((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
                    *)BVar53,
                   (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
                    *)local_1f28);
    }
    uVar52 = CONCAT71((int7)(CONCAT44(uStack_1e9c,local_1ea0) >> 8),(byte)local_1ea0 | bVar65);
    uVar33 = local_1e30._0_4_;
  } while (local_2c0 < (this->cfg).branchingFactor);
  if (local_2c0 != 0) {
LAB_01382610:
    puVar45 = (uint *)(local_11b0._M_local_buf + 0xc);
    uVar50 = local_2c0;
    do {
      auVar69 = vcmpps_avx(ZEXT416((uint)(local_1e58->prims).super_PrimInfoMB.time_range.lower),
                           ZEXT416(puVar45[-1]),1);
      auVar71 = vcmpps_avx(ZEXT416(*puVar45),
                           ZEXT416((uint)(local_1e58->prims).super_PrimInfoMB.time_range.upper),1);
      auVar69 = vorps_avx(auVar69,auVar71);
      uVar52 = (ulong)(byte)((byte)uVar52 | auVar69[0]);
      puVar45 = puVar45 + 0x3c;
      uVar50 = uVar50 - 1;
    } while (uVar50 != 0);
  }
LAB_0138265a:
  if ((uVar52 & 1) == 0) {
    local_1d90.m128[0] = 3.13891e-43;
    local_1d90.m128[1] = 0.0;
    BVar53 = (BBox1f)(alloc.talloc0)->parent;
    if (alloc.alloc != *(FastAllocator **)((long)BVar53 + 8)) {
      local_1bc0[8] = 1;
      local_1bc0._0_8_ = BVar53;
      MutexSys::lock((MutexSys *)BVar53);
      if (*(long *)((long)BVar53 + 8) != 0) {
        LOCK();
        plVar2 = (long *)(*(long *)((long)BVar53 + 8) + 0x118);
        *plVar2 = *plVar2 + *(long *)((long)BVar53 + 0xa8) + *(long *)((long)BVar53 + 0x68);
        UNLOCK();
        LOCK();
        plVar2 = (long *)(*(long *)((long)BVar53 + 8) + 0x120);
        *plVar2 = *plVar2 + ((*(long *)((long)BVar53 + 0x58) + *(long *)((long)BVar53 + 0x98)) -
                            (*(long *)((long)BVar53 + 0x50) + *(long *)((long)BVar53 + 0x90)));
        UNLOCK();
        LOCK();
        plVar2 = (long *)(*(long *)((long)BVar53 + 8) + 0x128);
        *plVar2 = *plVar2 + *(long *)((long)BVar53 + 0xb0) + *(long *)((long)BVar53 + 0x70);
        UNLOCK();
      }
      auVar69 = ZEXT816(0) << 0x40;
      *(undefined1 (*) [32])((long)BVar53 + 0x58) = ZEXT1632(auVar69);
      *(undefined1 (*) [32])((long)BVar53 + 0x48) = ZEXT1632(auVar69);
      auVar75 = ZEXT1632(auVar69);
      if (alloc.alloc == (FastAllocator *)0x0) {
        *(undefined1 (*) [32])((long)BVar53 + 0x98) = auVar75;
        *(undefined1 (*) [32])((long)BVar53 + 0x88) = auVar75;
      }
      else {
        *(size_t *)((long)BVar53 + 0x60) = (alloc.alloc)->defaultBlockSize;
        *(undefined1 (*) [32])((long)BVar53 + 0x88) = auVar75;
        *(undefined1 (*) [32])((long)BVar53 + 0x98) = auVar75;
        *(size_t *)((long)BVar53 + 0xa0) = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      *(FastAllocator **)((long)BVar53 + 8) = alloc.alloc;
      UNLOCK();
      local_1cb0._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
      local_1cb0[8] = 1;
      local_1e20._0_8_ = BVar53;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar9._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar9._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar9,(ThreadLocal2 **)local_1e20);
      }
      else {
        *iVar9._M_current = (ThreadLocal2 *)local_1e20._0_8_;
        pppTVar3 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar3 = *pppTVar3 + 1;
      }
      MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      if (local_1bc0[8] == '\x01') {
        MutexSys::unlock((MutexSys *)local_1bc0._0_8_);
      }
    }
    (alloc.talloc0)->bytesUsed = (alloc.talloc0)->bytesUsed + local_1d90._0_8_;
    sVar39 = (alloc.talloc0)->cur;
    uVar52 = (ulong)(-(int)sVar39 & 0xf);
    uVar50 = sVar39 + local_1d90._0_8_ + uVar52;
    (alloc.talloc0)->cur = uVar50;
    if ((alloc.talloc0)->end < uVar50) {
      (alloc.talloc0)->cur = sVar39;
      if ((alloc.talloc0)->allocBlockSize < (ulong)(local_1d90._0_8_ << 2)) {
        pcVar51 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_1d90);
      }
      else {
        local_1cb0._0_8_ = (alloc.talloc0)->allocBlockSize;
        pcVar51 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)local_1cb0);
        (alloc.talloc0)->ptr = pcVar51;
        sVar39 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar39;
        (alloc.talloc0)->end = local_1cb0._0_8_;
        (alloc.talloc0)->cur = local_1d90._0_8_;
        if ((ulong)local_1cb0._0_8_ < (ulong)local_1d90._0_8_) {
          (alloc.talloc0)->cur = 0;
          local_1cb0._0_8_ = (alloc.talloc0)->allocBlockSize;
          pcVar51 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)local_1cb0);
          (alloc.talloc0)->ptr = pcVar51;
          sVar39 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
          (alloc.talloc0)->bytesWasted = sVar39;
          (alloc.talloc0)->end = local_1cb0._0_8_;
          (alloc.talloc0)->cur = local_1d90._0_8_;
          if ((ulong)local_1cb0._0_8_ < (ulong)local_1d90._0_8_) {
            (alloc.talloc0)->cur = 0;
            pcVar51 = (char *)0x0;
            goto LAB_013829ec;
          }
        }
        (alloc.talloc0)->bytesWasted = sVar39;
      }
    }
    else {
      (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar52;
      pcVar51 = (alloc.talloc0)->ptr + (uVar50 - local_1d90._0_8_);
    }
LAB_013829ec:
    local_1f20._0_4_ = 1;
    uVar52 = 0;
    goto LAB_013829f3;
  }
  local_1d90.m128[0] = 3.58732e-43;
  local_1d90.m128[1] = 0.0;
  BVar44 = (BBox1f)(alloc.talloc0)->parent;
  if (alloc.alloc != *(FastAllocator **)((long)BVar44 + 8)) {
    local_1bc0[8] = 1;
    local_1bc0._0_8_ = BVar44;
    MutexSys::lock((MutexSys *)BVar44);
    if (*(long *)((long)BVar44 + 8) != 0) {
      LOCK();
      plVar2 = (long *)(*(long *)((long)BVar44 + 8) + 0x118);
      *plVar2 = *plVar2 + *(long *)((long)BVar44 + 0xa8) + *(long *)((long)BVar44 + 0x68);
      UNLOCK();
      LOCK();
      plVar2 = (long *)(*(long *)((long)BVar44 + 8) + 0x120);
      *plVar2 = *plVar2 + ((*(long *)((long)BVar44 + 0x58) + *(long *)((long)BVar44 + 0x98)) -
                          (*(long *)((long)BVar44 + 0x50) + *(long *)((long)BVar44 + 0x90)));
      UNLOCK();
      LOCK();
      plVar2 = (long *)(*(long *)((long)BVar44 + 8) + 0x128);
      *plVar2 = *plVar2 + *(long *)((long)BVar44 + 0xb0) + *(long *)((long)BVar44 + 0x70);
      UNLOCK();
    }
    auVar69 = ZEXT816(0) << 0x40;
    *(undefined1 (*) [32])((long)BVar44 + 0x58) = ZEXT1632(auVar69);
    *(undefined1 (*) [32])((long)BVar44 + 0x48) = ZEXT1632(auVar69);
    auVar75 = ZEXT1632(auVar69);
    if (alloc.alloc == (FastAllocator *)0x0) {
      *(undefined1 (*) [32])((long)BVar44 + 0x98) = auVar75;
      *(undefined1 (*) [32])((long)BVar44 + 0x88) = auVar75;
    }
    else {
      *(size_t *)((long)BVar44 + 0x60) = (alloc.alloc)->defaultBlockSize;
      *(undefined1 (*) [32])((long)BVar44 + 0x88) = auVar75;
      *(undefined1 (*) [32])((long)BVar44 + 0x98) = auVar75;
      *(size_t *)((long)BVar44 + 0xa0) = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    *(FastAllocator **)((long)BVar44 + 8) = alloc.alloc;
    UNLOCK();
    local_1cb0._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
    local_1cb0[8] = 1;
    local_1e20._0_8_ = BVar44;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    iVar9._M_current =
         ((alloc.alloc)->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar9._M_current ==
        ((alloc.alloc)->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&(alloc.alloc)->thread_local_allocators,iVar9,(ThreadLocal2 **)local_1e20);
    }
    else {
      *iVar9._M_current = (ThreadLocal2 *)local_1e20._0_8_;
      pppTVar3 = &((alloc.alloc)->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar3 = *pppTVar3 + 1;
    }
    BVar53 = (BBox1f)&FastAllocator::s_thread_local_allocators_lock;
    MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    if (local_1bc0[8] == '\x01') {
      BVar53 = (BBox1f)local_1bc0._0_8_;
      MutexSys::unlock((MutexSys *)local_1bc0._0_8_);
    }
  }
  (alloc.talloc0)->bytesUsed = (alloc.talloc0)->bytesUsed + local_1d90._0_8_;
  sVar39 = (alloc.talloc0)->cur;
  uVar52 = (ulong)(-(int)sVar39 & 0xf);
  uVar50 = sVar39 + local_1d90._0_8_ + uVar52;
  (alloc.talloc0)->cur = uVar50;
  if ((alloc.talloc0)->end < uVar50) {
    (alloc.talloc0)->cur = sVar39;
    BVar53 = (BBox1f)alloc.alloc;
    if ((alloc.talloc0)->allocBlockSize < (ulong)(local_1d90._0_8_ << 2)) {
      pcVar51 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_1d90);
    }
    else {
      local_1cb0._0_8_ = (alloc.talloc0)->allocBlockSize;
      pcVar51 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)local_1cb0);
      (alloc.talloc0)->ptr = pcVar51;
      sVar39 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
      (alloc.talloc0)->bytesWasted = sVar39;
      (alloc.talloc0)->end = local_1cb0._0_8_;
      (alloc.talloc0)->cur = local_1d90._0_8_;
      if ((ulong)local_1cb0._0_8_ < (ulong)local_1d90._0_8_) {
        (alloc.talloc0)->cur = 0;
        local_1cb0._0_8_ = (alloc.talloc0)->allocBlockSize;
        BVar53 = (BBox1f)alloc.alloc;
        pcVar51 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)local_1cb0);
        (alloc.talloc0)->ptr = pcVar51;
        sVar39 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar39;
        (alloc.talloc0)->end = local_1cb0._0_8_;
        (alloc.talloc0)->cur = local_1d90._0_8_;
        if ((ulong)local_1cb0._0_8_ < (ulong)local_1d90._0_8_) {
          (alloc.talloc0)->cur = 0;
          pcVar51 = (char *)0x0;
          goto LAB_01382952;
        }
      }
      (alloc.talloc0)->bytesWasted = sVar39;
    }
  }
  else {
    (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar52;
    pcVar51 = (alloc.talloc0)->ptr + (uVar50 - local_1d90._0_8_);
  }
LAB_01382952:
  pcVar51[0xe0] = '\0';
  pcVar51[0xe1] = '\0';
  pcVar51[0xe2] = -0x80;
  pcVar51[0xe3] = '\x7f';
  pcVar51[0xe4] = '\0';
  pcVar51[0xe5] = '\0';
  pcVar51[0xe6] = -0x80;
  pcVar51[0xe7] = '\x7f';
  pcVar51[0xe8] = '\0';
  pcVar51[0xe9] = '\0';
  pcVar51[0xea] = -0x80;
  pcVar51[0xeb] = '\x7f';
  pcVar51[0xec] = '\0';
  pcVar51[0xed] = '\0';
  pcVar51[0xee] = -0x80;
  pcVar51[0xef] = '\x7f';
  pcVar51[0xf0] = '\0';
  pcVar51[0xf1] = '\0';
  pcVar51[0xf2] = -0x80;
  pcVar51[0xf3] = -1;
  pcVar51[0xf4] = '\0';
  pcVar51[0xf5] = '\0';
  pcVar51[0xf6] = -0x80;
  pcVar51[0xf7] = -1;
  pcVar51[0xf8] = '\0';
  pcVar51[0xf9] = '\0';
  pcVar51[0xfa] = -0x80;
  pcVar51[0xfb] = -1;
  pcVar51[0xfc] = '\0';
  pcVar51[0xfd] = '\0';
  pcVar51[0xfe] = -0x80;
  pcVar51[0xff] = -1;
  uVar52 = CONCAT71(BVar53._1_7_,1);
  local_1f20._0_4_ = 6;
LAB_013829f3:
  pcVar51[0x60] = '\0';
  pcVar51[0x61] = '\0';
  pcVar51[0x62] = -0x80;
  pcVar51[99] = '\x7f';
  pcVar51[100] = '\0';
  pcVar51[0x65] = '\0';
  pcVar51[0x66] = -0x80;
  pcVar51[0x67] = '\x7f';
  pcVar51[0x68] = '\0';
  pcVar51[0x69] = '\0';
  pcVar51[0x6a] = -0x80;
  pcVar51[0x6b] = '\x7f';
  pcVar51[0x6c] = '\0';
  pcVar51[0x6d] = '\0';
  pcVar51[0x6e] = -0x80;
  pcVar51[0x6f] = '\x7f';
  pcVar51[0x40] = '\0';
  pcVar51[0x41] = '\0';
  pcVar51[0x42] = -0x80;
  pcVar51[0x43] = '\x7f';
  pcVar51[0x44] = '\0';
  pcVar51[0x45] = '\0';
  pcVar51[0x46] = -0x80;
  pcVar51[0x47] = '\x7f';
  pcVar51[0x48] = '\0';
  pcVar51[0x49] = '\0';
  pcVar51[0x4a] = -0x80;
  pcVar51[0x4b] = '\x7f';
  pcVar51[0x4c] = '\0';
  pcVar51[0x4d] = '\0';
  pcVar51[0x4e] = -0x80;
  pcVar51[0x4f] = '\x7f';
  pcVar51[0x20] = '\0';
  pcVar51[0x21] = '\0';
  pcVar51[0x22] = -0x80;
  pcVar51[0x23] = '\x7f';
  pcVar51[0x24] = '\0';
  pcVar51[0x25] = '\0';
  pcVar51[0x26] = -0x80;
  pcVar51[0x27] = '\x7f';
  pcVar51[0x28] = '\0';
  pcVar51[0x29] = '\0';
  pcVar51[0x2a] = -0x80;
  pcVar51[0x2b] = '\x7f';
  pcVar51[0x2c] = '\0';
  pcVar51[0x2d] = '\0';
  pcVar51[0x2e] = -0x80;
  pcVar51[0x2f] = '\x7f';
  pcVar51[0x70] = '\0';
  pcVar51[0x71] = '\0';
  pcVar51[0x72] = -0x80;
  pcVar51[0x73] = -1;
  pcVar51[0x74] = '\0';
  pcVar51[0x75] = '\0';
  pcVar51[0x76] = -0x80;
  pcVar51[0x77] = -1;
  pcVar51[0x78] = '\0';
  pcVar51[0x79] = '\0';
  pcVar51[0x7a] = -0x80;
  pcVar51[0x7b] = -1;
  pcVar51[0x7c] = '\0';
  pcVar51[0x7d] = '\0';
  pcVar51[0x7e] = -0x80;
  pcVar51[0x7f] = -1;
  pcVar51[0x50] = '\0';
  pcVar51[0x51] = '\0';
  pcVar51[0x52] = -0x80;
  pcVar51[0x53] = -1;
  pcVar51[0x54] = '\0';
  pcVar51[0x55] = '\0';
  pcVar51[0x56] = -0x80;
  pcVar51[0x57] = -1;
  pcVar51[0x58] = '\0';
  pcVar51[0x59] = '\0';
  pcVar51[0x5a] = -0x80;
  pcVar51[0x5b] = -1;
  pcVar51[0x5c] = '\0';
  pcVar51[0x5d] = '\0';
  pcVar51[0x5e] = -0x80;
  pcVar51[0x5f] = -1;
  pcVar51[0x30] = '\0';
  pcVar51[0x31] = '\0';
  pcVar51[0x32] = -0x80;
  pcVar51[0x33] = -1;
  pcVar51[0x34] = '\0';
  pcVar51[0x35] = '\0';
  pcVar51[0x36] = -0x80;
  pcVar51[0x37] = -1;
  pcVar51[0x38] = '\0';
  pcVar51[0x39] = '\0';
  pcVar51[0x3a] = -0x80;
  pcVar51[0x3b] = -1;
  pcVar51[0x3c] = '\0';
  pcVar51[0x3d] = '\0';
  pcVar51[0x3e] = -0x80;
  pcVar51[0x3f] = -1;
  auVar69 = ZEXT816(0) << 0x40;
  *(undefined1 (*) [32])(pcVar51 + 0x80) = ZEXT1632(auVar69);
  *(undefined1 (*) [32])(pcVar51 + 0xa0) = ZEXT1632(auVar69);
  *(undefined1 (*) [32])(pcVar51 + 0xc0) = ZEXT1632(auVar69);
  pcVar51[0] = '\b';
  pcVar51[1] = '\0';
  pcVar51[2] = '\0';
  pcVar51[3] = '\0';
  pcVar51[4] = '\0';
  pcVar51[5] = '\0';
  pcVar51[6] = '\0';
  pcVar51[7] = '\0';
  pcVar51[8] = '\b';
  pcVar51[9] = '\0';
  pcVar51[10] = '\0';
  pcVar51[0xb] = '\0';
  pcVar51[0xc] = '\0';
  pcVar51[0xd] = '\0';
  pcVar51[0xe] = '\0';
  pcVar51[0xf] = '\0';
  pcVar51[0x10] = '\b';
  pcVar51[0x11] = '\0';
  pcVar51[0x12] = '\0';
  pcVar51[0x13] = '\0';
  pcVar51[0x14] = '\0';
  pcVar51[0x15] = '\0';
  pcVar51[0x16] = '\0';
  pcVar51[0x17] = '\0';
  pcVar51[0x18] = '\b';
  pcVar51[0x19] = '\0';
  pcVar51[0x1a] = '\0';
  pcVar51[0x1b] = '\0';
  pcVar51[0x1c] = '\0';
  pcVar51[0x1d] = '\0';
  pcVar51[0x1e] = '\0';
  pcVar51[0x1f] = '\0';
  local_1f20._0_4_ = (uint)local_1f20 | (uint)pcVar51;
  local_1f20._4_4_ = (undefined4)((ulong)pcVar51 >> 0x20);
  local_1ec0._8_4_ = 0xff800000;
  local_1ec0._M_allocated_capacity = 0xff800000ff800000;
  local_1ec0._12_4_ = 0xff800000;
  fVar85 = INFINITY;
  fVar91 = INFINITY;
  fVar107 = INFINITY;
  fVar137 = INFINITY;
  if (local_2c0 != 0) {
    local_1ea0 = (uint)uVar52;
    pBVar48 = &local_17f0;
    uVar52 = 0;
    local_1eb0.m128[2] = INFINITY;
    local_1eb0._0_8_ = 0x7f8000007f800000;
    local_1eb0.m128[3] = INFINITY;
    fStack_1ee8 = INFINITY;
    local_1ef0 = (undefined1  [8])0x7f8000007f800000;
    fStack_1ee4 = INFINITY;
    local_1ee0.m128[2] = -INFINITY;
    local_1ee0._0_8_ = 0xff800000ff800000;
    local_1ee0.m128[3] = -INFINITY;
    local_1ec0._8_4_ = 0xff800000;
    local_1ec0._M_allocated_capacity = 0xff800000ff800000;
    local_1ec0._12_4_ = 0xff800000;
    in_00 = (BuildRecord *)local_1240;
    do {
      createLargeLeaf((NodeRecordMB4D *)local_1cb0,this,in_00,alloc);
      pBVar48[-10].lower = (float)local_1cb0._0_4_;
      pBVar48[-10].upper = (float)local_1cb0._4_4_;
      auVar22._8_8_ = local_1ca0._8_8_;
      auVar22._0_8_ = local_1ca0._0_8_;
      *(undefined1 (*) [16])(pBVar48 + -8) = auVar22;
      auVar23._8_8_ = aStack_1c90._8_8_;
      auVar23._0_8_ = aStack_1c90._0_8_;
      *(undefined1 (*) [16])(pBVar48 + -6) = auVar23;
      auVar24._8_8_ = local_1c80._8_8_;
      auVar24._0_8_ = local_1c80._0_8_;
      *(undefined1 (*) [16])(pBVar48 + -4) = auVar24;
      auVar25._8_8_ = aStack_1c70._8_8_;
      auVar25._0_8_ = aStack_1c70._0_8_;
      *(undefined1 (*) [16])(pBVar48 + -2) = auVar25;
      *pBVar48 = local_1c60;
      local_1eb0.m128 = (__m128)vminps_avx(local_1eb0.m128,auVar22);
      local_1ee0.m128 = (__m128)vmaxps_avx(local_1ee0.m128,auVar23);
      _local_1ef0 = (__m128)vminps_avx(_local_1ef0,auVar24);
      local_1ec0._M_local_buf = (char  [16])vmaxps_avx(local_1ec0._M_local_buf,auVar25);
      uVar52 = uVar52 + 1;
      pBVar48 = pBVar48 + 0xc;
      in_00 = (BuildRecord *)
              &in_00[1].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
               geomBounds.bounds1.upper;
    } while (uVar52 < local_2c0);
    if (((uint)local_1f20 & 0xf) == 1) {
      if (local_2c0 != 0) {
        uVar52 = (ulong)pcVar51 & 0xfffffffffffffff0;
        pfVar46 = &local_17f0.upper;
        lVar43 = 0;
        auVar89._8_4_ = 0x7f7fffff;
        auVar89._0_8_ = 0x7f7fffff7f7fffff;
        auVar89._12_4_ = 0x7f7fffff;
        auVar93._8_4_ = 0xff7fffff;
        auVar93._0_8_ = 0xff7fffffff7fffff;
        auVar93._12_4_ = 0xff7fffff;
        auVar96._8_4_ = 0x7fffffff;
        auVar96._0_8_ = 0x7fffffff7fffffff;
        auVar96._12_4_ = 0x7fffffff;
        do {
          *(undefined8 *)(uVar52 + lVar43 * 8) = *(undefined8 *)(pfVar46 + -0x15);
          fVar85 = ((BBox1f *)(pfVar46 + -1))->lower;
          fVar107 = 1.0 / (*pfVar46 - fVar85);
          fVar91 = -fVar85 * fVar107;
          auVar69 = vshufps_avx(ZEXT416((uint)fVar91),ZEXT416((uint)fVar91),0);
          auVar71 = vshufps_avx(ZEXT416((uint)(1.0 - fVar91)),ZEXT416((uint)(1.0 - fVar91)),0);
          auVar156._0_4_ = pfVar46[-9] * auVar69._0_4_ + pfVar46[-0x11] * auVar71._0_4_;
          auVar156._4_4_ = pfVar46[-8] * auVar69._4_4_ + pfVar46[-0x10] * auVar71._4_4_;
          auVar156._8_4_ = pfVar46[-7] * auVar69._8_4_ + pfVar46[-0xf] * auVar71._8_4_;
          auVar156._12_4_ = pfVar46[-6] * auVar69._12_4_ + pfVar46[-0xe] * auVar71._12_4_;
          auVar128._0_4_ = pfVar46[-5] * auVar69._0_4_ + pfVar46[-0xd] * auVar71._0_4_;
          auVar128._4_4_ = pfVar46[-4] * auVar69._4_4_ + pfVar46[-0xc] * auVar71._4_4_;
          auVar128._8_4_ = pfVar46[-3] * auVar69._8_4_ + pfVar46[-0xb] * auVar71._8_4_;
          auVar128._12_4_ = pfVar46[-2] * auVar69._12_4_ + pfVar46[-10] * auVar71._12_4_;
          fVar107 = (1.0 - fVar85) * fVar107;
          auVar69 = vshufps_avx(ZEXT416((uint)fVar107),ZEXT416((uint)fVar107),0);
          auVar71 = vshufps_avx(ZEXT416((uint)(1.0 - fVar107)),ZEXT416((uint)(1.0 - fVar107)),0);
          auVar138._0_4_ = pfVar46[-9] * auVar69._0_4_ + pfVar46[-0x11] * auVar71._0_4_;
          auVar138._4_4_ = pfVar46[-8] * auVar69._4_4_ + pfVar46[-0x10] * auVar71._4_4_;
          auVar138._8_4_ = pfVar46[-7] * auVar69._8_4_ + pfVar46[-0xf] * auVar71._8_4_;
          auVar138._12_4_ = pfVar46[-6] * auVar69._12_4_ + pfVar46[-0xe] * auVar71._12_4_;
          auVar108._0_4_ = pfVar46[-5] * auVar69._0_4_ + pfVar46[-0xd] * auVar71._0_4_;
          auVar108._4_4_ = pfVar46[-4] * auVar69._4_4_ + pfVar46[-0xc] * auVar71._4_4_;
          auVar108._8_4_ = pfVar46[-3] * auVar69._8_4_ + pfVar46[-0xb] * auVar71._8_4_;
          auVar108._12_4_ = pfVar46[-2] * auVar69._12_4_ + pfVar46[-10] * auVar71._12_4_;
          auVar99 = vminps_avx(auVar156,auVar89);
          auVar71 = vmaxps_avx(auVar128,auVar93);
          auVar80 = vminps_avx(auVar138,auVar89);
          auVar70 = vmaxps_avx(auVar108,auVar93);
          auVar69 = vandps_avx(auVar99,auVar96);
          auVar143._0_4_ = auVar69._0_4_ * 4.7683716e-07;
          auVar143._4_4_ = auVar69._4_4_ * 4.7683716e-07;
          auVar143._8_4_ = auVar69._8_4_ * 4.7683716e-07;
          auVar143._12_4_ = auVar69._12_4_ * 4.7683716e-07;
          auVar99 = vsubps_avx(auVar99,auVar143);
          auVar69 = vandps_avx(auVar71,auVar96);
          auVar129._0_4_ = auVar71._0_4_ + auVar69._0_4_ * 4.7683716e-07;
          auVar129._4_4_ = auVar71._4_4_ + auVar69._4_4_ * 4.7683716e-07;
          auVar129._8_4_ = auVar71._8_4_ + auVar69._8_4_ * 4.7683716e-07;
          auVar129._12_4_ = auVar71._12_4_ + auVar69._12_4_ * 4.7683716e-07;
          auVar69 = vandps_avx(auVar80,auVar96);
          auVar144._0_4_ = auVar69._0_4_ * 4.7683716e-07;
          auVar144._4_4_ = auVar69._4_4_ * 4.7683716e-07;
          auVar144._8_4_ = auVar69._8_4_ * 4.7683716e-07;
          auVar144._12_4_ = auVar69._12_4_ * 4.7683716e-07;
          auVar71 = vsubps_avx(auVar80,auVar144);
          auVar69 = vandps_avx(auVar70,auVar96);
          *(int *)(uVar52 + 0x20 + lVar43 * 4) = auVar99._0_4_;
          uVar55 = vextractps_avx(auVar99,1);
          *(undefined4 *)(uVar52 + 0x40 + lVar43 * 4) = uVar55;
          auVar109._0_4_ = auVar69._0_4_ * 4.7683716e-07 + auVar70._0_4_;
          auVar109._4_4_ = auVar69._4_4_ * 4.7683716e-07 + auVar70._4_4_;
          auVar109._8_4_ = auVar69._8_4_ * 4.7683716e-07 + auVar70._8_4_;
          auVar109._12_4_ = auVar69._12_4_ * 4.7683716e-07 + auVar70._12_4_;
          uVar55 = vextractps_avx(auVar99,2);
          *(undefined4 *)(uVar52 + 0x60 + lVar43 * 4) = uVar55;
          *(float *)(uVar52 + 0x30 + lVar43 * 4) = auVar129._0_4_;
          uVar55 = vextractps_avx(auVar129,1);
          *(undefined4 *)(uVar52 + 0x50 + lVar43 * 4) = uVar55;
          auVar69 = vsubps_avx(auVar71,auVar99);
          uVar55 = vextractps_avx(auVar129,2);
          *(undefined4 *)(uVar52 + 0x70 + lVar43 * 4) = uVar55;
          *(int *)(uVar52 + 0x80 + lVar43 * 4) = auVar69._0_4_;
          uVar55 = vextractps_avx(auVar69,1);
          *(undefined4 *)(uVar52 + 0xa0 + lVar43 * 4) = uVar55;
          auVar71 = vsubps_avx(auVar109,auVar129);
          uVar55 = vextractps_avx(auVar69,2);
          *(undefined4 *)(uVar52 + 0xc0 + lVar43 * 4) = uVar55;
          *(int *)(uVar52 + 0x90 + lVar43 * 4) = auVar71._0_4_;
          uVar55 = vextractps_avx(auVar71,1);
          *(undefined4 *)(uVar52 + 0xb0 + lVar43 * 4) = uVar55;
          uVar55 = vextractps_avx(auVar71,2);
          *(undefined4 *)(uVar52 + 0xd0 + lVar43 * 4) = uVar55;
          lVar43 = lVar43 + 1;
          pfVar46 = pfVar46 + 0x18;
        } while (local_2c0 != lVar43);
      }
    }
    else if (local_2c0 != 0) {
      uVar52 = (ulong)pcVar51 & 0xfffffffffffffff0;
      pfVar46 = &local_17f0.upper;
      lVar43 = 0;
      auVar90._8_4_ = 0x7f7fffff;
      auVar90._0_8_ = 0x7f7fffff7f7fffff;
      auVar90._12_4_ = 0x7f7fffff;
      auVar95._8_4_ = 0xff7fffff;
      auVar95._0_8_ = 0xff7fffffff7fffff;
      auVar95._12_4_ = 0xff7fffff;
      auVar98._8_4_ = 0x7fffffff;
      auVar98._0_8_ = 0x7fffffff7fffffff;
      auVar98._12_4_ = 0x7fffffff;
      auVar119._8_4_ = 0x3f800001;
      auVar119._0_8_ = 0x3f8000013f800001;
      auVar119._12_4_ = 0x3f800001;
      do {
        *(undefined8 *)(uVar52 + lVar43 * 8) = *(undefined8 *)(pfVar46 + -0x15);
        fVar85 = *pfVar46;
        fVar91 = ((BBox1f *)(pfVar46 + -1))->lower;
        fVar137 = 1.0 / (fVar85 - fVar91);
        fVar107 = fVar137 * -fVar91;
        auVar69 = vshufps_avx(ZEXT416((uint)fVar107),ZEXT416((uint)fVar107),0);
        auVar71 = vshufps_avx(ZEXT416((uint)(1.0 - fVar107)),ZEXT416((uint)(1.0 - fVar107)),0);
        auVar84._0_4_ = pfVar46[-9] * auVar69._0_4_ + pfVar46[-0x11] * auVar71._0_4_;
        auVar84._4_4_ = pfVar46[-8] * auVar69._4_4_ + pfVar46[-0x10] * auVar71._4_4_;
        auVar84._8_4_ = pfVar46[-7] * auVar69._8_4_ + pfVar46[-0xf] * auVar71._8_4_;
        auVar84._12_4_ = pfVar46[-6] * auVar69._12_4_ + pfVar46[-0xe] * auVar71._12_4_;
        auVar145._0_4_ = pfVar46[-5] * auVar69._0_4_ + pfVar46[-0xd] * auVar71._0_4_;
        auVar145._4_4_ = pfVar46[-4] * auVar69._4_4_ + pfVar46[-0xc] * auVar71._4_4_;
        auVar145._8_4_ = pfVar46[-3] * auVar69._8_4_ + pfVar46[-0xb] * auVar71._8_4_;
        auVar145._12_4_ = pfVar46[-2] * auVar69._12_4_ + pfVar46[-10] * auVar71._12_4_;
        fVar137 = (1.0 - fVar91) * fVar137;
        auVar69 = vshufps_avx(ZEXT416((uint)fVar137),ZEXT416((uint)fVar137),0);
        auVar71 = vshufps_avx(ZEXT416((uint)(1.0 - fVar137)),ZEXT416((uint)(1.0 - fVar137)),0);
        auVar150._0_4_ = pfVar46[-9] * auVar69._0_4_ + pfVar46[-0x11] * auVar71._0_4_;
        auVar150._4_4_ = pfVar46[-8] * auVar69._4_4_ + pfVar46[-0x10] * auVar71._4_4_;
        auVar150._8_4_ = pfVar46[-7] * auVar69._8_4_ + pfVar46[-0xf] * auVar71._8_4_;
        auVar150._12_4_ = pfVar46[-6] * auVar69._12_4_ + pfVar46[-0xe] * auVar71._12_4_;
        auVar141._0_4_ = pfVar46[-5] * auVar69._0_4_ + pfVar46[-0xd] * auVar71._0_4_;
        auVar141._4_4_ = pfVar46[-4] * auVar69._4_4_ + pfVar46[-0xc] * auVar71._4_4_;
        auVar141._8_4_ = pfVar46[-3] * auVar69._8_4_ + pfVar46[-0xb] * auVar71._8_4_;
        auVar141._12_4_ = pfVar46[-2] * auVar69._12_4_ + pfVar46[-10] * auVar71._12_4_;
        auVar99 = vminps_avx(auVar84,auVar90);
        auVar71 = vmaxps_avx(auVar145,auVar95);
        auVar80 = vminps_avx(auVar150,auVar90);
        auVar70 = vmaxps_avx(auVar141,auVar95);
        auVar69 = vandps_avx(auVar99,auVar98);
        auVar151._0_4_ = auVar69._0_4_ * 4.7683716e-07;
        auVar151._4_4_ = auVar69._4_4_ * 4.7683716e-07;
        auVar151._8_4_ = auVar69._8_4_ * 4.7683716e-07;
        auVar151._12_4_ = auVar69._12_4_ * 4.7683716e-07;
        auVar99 = vsubps_avx(auVar99,auVar151);
        auVar69 = vandps_avx(auVar71,auVar98);
        auVar146._0_4_ = auVar71._0_4_ + auVar69._0_4_ * 4.7683716e-07;
        auVar146._4_4_ = auVar71._4_4_ + auVar69._4_4_ * 4.7683716e-07;
        auVar146._8_4_ = auVar71._8_4_ + auVar69._8_4_ * 4.7683716e-07;
        auVar146._12_4_ = auVar71._12_4_ + auVar69._12_4_ * 4.7683716e-07;
        auVar69 = vandps_avx(auVar80,auVar98);
        auVar152._0_4_ = auVar69._0_4_ * 4.7683716e-07;
        auVar152._4_4_ = auVar69._4_4_ * 4.7683716e-07;
        auVar152._8_4_ = auVar69._8_4_ * 4.7683716e-07;
        auVar152._12_4_ = auVar69._12_4_ * 4.7683716e-07;
        auVar71 = vsubps_avx(auVar80,auVar152);
        auVar69 = vandps_avx(auVar70,auVar98);
        *(int *)(uVar52 + 0x20 + lVar43 * 4) = auVar99._0_4_;
        uVar55 = vextractps_avx(auVar99,1);
        *(undefined4 *)(uVar52 + 0x40 + lVar43 * 4) = uVar55;
        auVar142._0_4_ = auVar70._0_4_ + auVar69._0_4_ * 4.7683716e-07;
        auVar142._4_4_ = auVar70._4_4_ + auVar69._4_4_ * 4.7683716e-07;
        auVar142._8_4_ = auVar70._8_4_ + auVar69._8_4_ * 4.7683716e-07;
        auVar142._12_4_ = auVar70._12_4_ + auVar69._12_4_ * 4.7683716e-07;
        uVar55 = vextractps_avx(auVar99,2);
        *(undefined4 *)(uVar52 + 0x60 + lVar43 * 4) = uVar55;
        *(float *)(uVar52 + 0x30 + lVar43 * 4) = auVar146._0_4_;
        uVar55 = vextractps_avx(auVar146,1);
        *(undefined4 *)(uVar52 + 0x50 + lVar43 * 4) = uVar55;
        auVar69 = vsubps_avx(auVar71,auVar99);
        uVar55 = vextractps_avx(auVar146,2);
        *(undefined4 *)(uVar52 + 0x70 + lVar43 * 4) = uVar55;
        *(int *)(uVar52 + 0x80 + lVar43 * 4) = auVar69._0_4_;
        uVar55 = vextractps_avx(auVar69,1);
        *(undefined4 *)(uVar52 + 0xa0 + lVar43 * 4) = uVar55;
        auVar71 = vsubps_avx(auVar142,auVar146);
        uVar55 = vextractps_avx(auVar69,2);
        *(undefined4 *)(uVar52 + 0xc0 + lVar43 * 4) = uVar55;
        *(int *)(uVar52 + 0x90 + lVar43 * 4) = auVar71._0_4_;
        uVar55 = vextractps_avx(auVar71,1);
        *(undefined4 *)(uVar52 + 0xb0 + lVar43 * 4) = uVar55;
        uVar55 = vextractps_avx(auVar71,2);
        *(undefined4 *)(uVar52 + 0xd0 + lVar43 * 4) = uVar55;
        *(float *)(uVar52 + 0xe0 + lVar43 * 4) = fVar91;
        auVar69 = vcmpss_avx(ZEXT416((uint)fVar85),SUB6416(ZEXT464(0x3f800000),0),0);
        auVar69 = vblendvps_avx(ZEXT416((uint)fVar85),auVar119,auVar69);
        *(int *)(uVar52 + 0xf0 + lVar43 * 4) = auVar69._0_4_;
        lVar43 = lVar43 + 1;
        pfVar46 = pfVar46 + 0x18;
      } while (local_2c0 != lVar43);
    }
    uVar52 = (ulong)local_1ea0;
    fVar85 = (float)local_1ef0._0_4_;
    fVar91 = (float)local_1ef0._4_4_;
    fVar107 = fStack_1ee8;
    fVar137 = fStack_1ee4;
  }
  BVar44 = BStack_18b8;
  BVar53 = local_18c0;
  if ((char)uVar52 == '\0') {
    (local_1e80->ref).ptr = CONCAT44(local_1f20._4_4_,(uint)local_1f20);
    *(undefined8 *)&(local_1e80->lbounds).bounds0.lower.field_0 = local_1eb0._0_8_;
    *(undefined8 *)((long)&(local_1e80->lbounds).bounds0.lower.field_0 + 8) = local_1eb0._8_8_;
    *(undefined8 *)&(local_1e80->lbounds).bounds0.upper.field_0 = local_1ee0._0_8_;
    *(undefined8 *)((long)&(local_1e80->lbounds).bounds0.upper.field_0 + 8) = local_1ee0._8_8_;
    (local_1e80->lbounds).bounds1.lower.field_0.m128[0] = fVar85;
    (local_1e80->lbounds).bounds1.lower.field_0.m128[1] = fVar91;
    (local_1e80->lbounds).bounds1.lower.field_0.m128[2] = fVar107;
    (local_1e80->lbounds).bounds1.lower.field_0.m128[3] = fVar137;
    uVar67 = local_1ec0._0_8_;
    uVar76 = local_1ec0._8_8_;
  }
  else {
    uStack_19a8 = (BBox1f)&this->recalculatePrimRef;
    local_19b0 = (undefined1  [8])&local_1920;
    local_1bc0._0_4_ = INFINITY;
    local_1bc0._4_4_ = INFINITY;
    local_1bc0._8_4_ = 0x7f800000;
    local_1bc0._12_4_ = 0x7f800000;
    local_1bb0._0_8_ = (BBox1f *)0xff800000ff800000;
    local_1bb0._8_4_ = -INFINITY;
    local_1bb0._12_4_ = -INFINITY;
    local_1bb0._16_8_ = 0x7f8000007f800000;
    local_1bb0._24_8_ = 0x7f8000007f800000;
    local_1bb0._32_8_ = 0xff800000ff800000;
    local_1bb0._40_8_ = 0xff800000ff800000;
    if ((ulong)((long)BStack_18b8 - (long)local_18c0) < 0xc00) {
      local_1cb0._0_4_ = local_18c0.lower;
      local_1cb0._4_4_ = local_18c0.upper;
      local_1cb0._8_4_ = BStack_18b8.lower;
      _uStack_1ca4 = BStack_18b8.upper;
      ::anon_func::anon_class_16_2_aeee9775::operator()
                ((LBBox3fa *)local_1e20,(anon_class_16_2_aeee9775 *)local_19b0,
                 (range<unsigned_long> *)local_1cb0);
      sVar39 = CONCAT44(local_1f20._4_4_,(uint)local_1f20);
    }
    else {
      uStack_1ca4 = 0x401;
      aStack_1c90.m128[0] = 0.0;
      aStack_1c90.m128[1] = 0.0;
      aStack_1c90.m128[2] = 0.0;
      aStack_1c90.m128[3] = 0.0;
      aStack_1c70.m128[0] = 1.12104e-44;
      aStack_1c70.m128[1] = 0.0;
      tbb::detail::r1::initialize((task_group_context *)local_1cb0);
      BVar62 = BStack_18b8;
      BVar36 = local_18c0;
      BStack_18b8.lower = BVar44.lower;
      BStack_18b8.upper = BVar44.upper;
      local_1d90.m128[0] = BStack_18b8.lower;
      local_1d90.m128[1] = BStack_18b8.upper;
      local_18c0.lower = BVar53.lower;
      local_18c0.upper = BVar53.upper;
      local_1d90.m128[2] = local_18c0.lower;
      local_1d90.m128[3] = local_18c0.upper;
      uStack_1d80 = 0x400;
      local_1a40._0_8_ = &local_1ad0;
      local_1a40._8_8_ = local_19b0;
      local_18c0 = BVar36;
      BStack_18b8 = BVar62;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::LBBox<embree::Vec3fa>,embree::parallel_reduce<unsigned_long,embree::LBBox<embree::Vec3fa>,embree::SetMB::linearBounds<embree::avx::GridRecalculatePrimRef>(embree::avx::GridRecalculatePrimRef_const&)const::_lambda(embree::range<unsigned_long>const&)_1_,embree::SetMB::linearBounds<embree::avx::GridRecalculatePrimRef>(embree::avx::GridRecalculatePrimRef_const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::LBBox<embree::Vec3fa>const&,embree::SetMB::linearBounds<embree::avx::GridRecalculatePrimRef>(embree::avx::GridRecalculatePrimRef_const&)const::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::SetMB::linearBounds<embree::avx::GridRecalculatePrimRef>(embree::avx::GridRecalculatePrimRef_const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::LBBox<embree::Vec3fa>const&)_1_,embree::SetMB::linearBounds<embree::avx::GridRecalculatePrimRef>(embree::avx::GridRecalculatePrimRef_const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>
                ((LBBox<embree::Vec3fa> *)local_1e20,(d1 *)&local_1d90.field_1,
                 (blocked_range<unsigned_long> *)local_1bc0,
                 (LBBox<embree::Vec3fa> *)(local_1a50 + 0x10),
                 (anon_class_16_2_ed117de8_conflict22 *)local_1a40._0_8_,
                 (anon_class_1_0_00000001 *)local_1cb0,in_stack_ffffffffffffe0c0);
      cVar32 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)local_1cb0);
      sVar39 = CONCAT44(local_1f20._4_4_,(uint)local_1f20);
      if (cVar32 != '\0') {
        prVar41 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar41,"task cancelled");
        __cxa_throw(prVar41,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::r1::destroy((task_group_context *)local_1cb0);
    }
    (local_1e80->ref).ptr = sVar39;
    *(undefined8 *)&(local_1e80->lbounds).bounds0.lower.field_0 = local_1e20._0_8_;
    *(ulong *)((long)&(local_1e80->lbounds).bounds0.lower.field_0 + 8) =
         CONCAT44(local_1e20._12_4_,local_1e20._8_4_);
    *(ulong *)&(local_1e80->lbounds).bounds0.upper.field_0 =
         CONCAT44(aStack_1e10.m128[1],aStack_1e10.m128[0]);
    *(ulong *)((long)&(local_1e80->lbounds).bounds0.upper.field_0 + 8) =
         CONCAT44(aStack_1e10.m128[3],aStack_1e10.m128[2]);
    *(ulong *)&(local_1e80->lbounds).bounds1.lower.field_0 =
         CONCAT44(local_1e00.m128[1],local_1e00.m128[0]);
    *(ulong *)((long)&(local_1e80->lbounds).bounds1.lower.field_0 + 8) =
         CONCAT44(local_1e00.m128[3],local_1e00.m128[2]);
    uVar67 = CONCAT44(aStack_1df0.m128[1],aStack_1df0.m128[0]);
    uVar76 = CONCAT44(aStack_1df0.m128[3],aStack_1df0.m128[2]);
  }
  *(undefined8 *)&(local_1e80->lbounds).bounds1.upper.field_0 = uVar67;
  *(undefined8 *)((long)&(local_1e80->lbounds).bounds1.upper.field_0 + 8) = uVar76;
  local_1e80->dt = BStack_1898;
  if (local_2c0 == 0) {
    return local_1e80;
  }
  uVar52 = 0;
  do {
    pBVar10 = local_340[uVar52];
    pBVar48 = pBVar10 + 1;
    *pBVar48 = (BBox1f)((long)*pBVar48 + -1);
    if (*pBVar48 == (BBox1f)0x0) {
      BVar53 = *pBVar10;
      if (BVar53 != (BBox1f)0x0) {
        lVar43 = *(long *)((long)BVar53 + 0x18);
        pvVar37 = *(void **)((long)BVar53 + 0x20);
        if (pvVar37 != (void *)0x0) {
          if ((ulong)(lVar43 * 0x50) < 0x1c00000) {
            alignedFree(pvVar37);
          }
          else {
            os_free(pvVar37,lVar43 * 0x50,*(bool *)((long)BVar53 + 8));
          }
        }
        if (lVar43 != 0) {
          (**(code **)**(undefined8 **)BVar53)(*(undefined8 **)BVar53,lVar43 * -0x50,1);
        }
        *(undefined8 *)((long)BVar53 + 0x10) = 0;
        *(undefined8 *)((long)BVar53 + 0x18) = 0;
        *(undefined8 *)((long)BVar53 + 0x20) = 0;
      }
      operator_delete((void *)BVar53);
    }
    uVar52 = uVar52 + 1;
  } while (uVar52 < local_2c0);
  return local_1e80;
}

Assistant:

const NodeRecordMB4D createLargeLeaf(const BuildRecord& in, Allocator alloc)
          {
            /* this should never occur but is a fatal error */
            if (in.depth > cfg.maxDepth)
              throw_RTCError(RTC_ERROR_UNKNOWN,"depth limit reached");

            /* replace already found split by fallback split */
            const BuildRecordSplit current(BuildRecord(in.prims,in.depth),findFallback(in.prims));

            /* special case when directly creating leaf without any splits that could shrink time_range */
            bool force_split = false;
            if (current.depth == 1 && current.size() > 0)
            {
              BBox1f c = empty;
              BBox1f p = current.prims.time_range;
              for (size_t i=current.prims.begin(); i<current.prims.end(); i++) {
                mvector<PrimRefMB>& prims = *current.prims.prims;
                c.extend(prims[i].time_range);
              }
              
              force_split = c.lower > p.lower || c.upper < p.upper;
            }
	    
            /* create leaf for few primitives */
            if (current.size() <= cfg.maxLeafSize && current.split.data < Split::SPLIT_ENFORCE && !force_split)
              return createLeaf(current,alloc);
	  
            /* fill all children by always splitting the largest one */
            bool hasTimeSplits = false;
            NodeRecordMB4D values[MAX_BRANCHING_FACTOR];
            LocalChildListSplit children(current);

            do {
              /* find best child with largest bounding box area */
              size_t bestChild = -1;
              size_t bestSize = 0;
              for (size_t i=0; i<children.size(); i++)
              {
                /* ignore leaves as they cannot get split */
                if (children[i].size() <= cfg.maxLeafSize && children[i].split.data < Split::SPLIT_ENFORCE && !force_split)
                  continue;

                force_split = false;
                
                /* remember child with largest size */
                if (children[i].size() > bestSize) {
                  bestSize = children[i].size();
                  bestChild = i;
                }
              }
              if (bestChild == -1) break;

              /* perform best found split */
              BuildRecordSplit& brecord = children[bestChild];
              BuildRecordSplit lrecord(current.depth+1);
              BuildRecordSplit rrecord(current.depth+1);
              std::unique_ptr<mvector<PrimRefMB>> new_vector = split(brecord.split,brecord.prims,lrecord.prims,rrecord.prims);
              hasTimeSplits |= new_vector != nullptr;

              /* find new splits */
              lrecord.split = findFallback(lrecord.prims);
              rrecord.split = findFallback(rrecord.prims);
              children.split(bestChild,lrecord,rrecord,std::move(new_vector));

            } while (children.size() < cfg.branchingFactor);

            /* detect time_ranges that have shrunken */
            for (size_t i=0; i<children.size(); i++) {
              const BBox1f c = children[i].prims.time_range;
              const BBox1f p = in.prims.time_range;
              hasTimeSplits |= c.lower > p.lower || c.upper < p.upper;
            }

            /* create node */
            auto node = createNode(children.children.data(),children.numChildren,alloc,hasTimeSplits);

            /* recurse into each child and perform reduction */
            LBBox3fa gbounds = empty;
            for (size_t i=0; i<children.size(); i++) {
              values[i] = createLargeLeaf(children[i],alloc);
              gbounds.extend(values[i].lbounds);
            }

            setNode(current,children.children.data(),node,values,children.numChildren);

            /* calculate geometry bounds of this node */
            if (hasTimeSplits)
              return NodeRecordMB4D(node,current.prims.linearBounds(recalculatePrimRef),current.prims.time_range);
            else
              return NodeRecordMB4D(node,gbounds,current.prims.time_range);
          }